

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  int iVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  ulong uVar71;
  long lVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  uint uVar77;
  Geometry *geometry;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  long lVar78;
  byte bVar79;
  float fVar80;
  float fVar81;
  float fVar126;
  float fVar127;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar87 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar129;
  float fVar132;
  float fVar133;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar134;
  float fVar135;
  undefined4 uVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar142;
  undefined1 auVar141 [32];
  undefined1 auVar144 [16];
  undefined8 uVar143;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar151;
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar170;
  undefined1 auVar169 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  LinearSpace3fa *local_5d0;
  Primitive *local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar185 [64];
  
  PVar12 = prim[1];
  uVar71 = (ulong)(byte)PVar12;
  lVar27 = uVar71 * 0x25;
  fVar152 = *(float *)(prim + lVar27 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar85 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar86 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + lVar27 + 6));
  fVar151 = fVar152 * auVar86._0_4_;
  fVar134 = fVar152 * auVar85._0_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar83);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar84);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar71 * 0xf + 6);
  auVar93 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar97 = vpmovsxbd_avx2(auVar7);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar95 = vcvtdq2ps_avx(auVar97);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar71 + 6);
  auVar96 = vpmovsxbd_avx2(auVar8);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar71 * 0x1a + 6);
  auVar103 = vpmovsxbd_avx2(auVar9);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar71 * 0x1b + 6);
  auVar102 = vpmovsxbd_avx2(auVar10);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar71 * 0x1c + 6);
  auVar90 = vpmovsxbd_avx2(auVar11);
  auVar98 = vcvtdq2ps_avx(auVar90);
  auVar165._4_4_ = fVar134;
  auVar165._0_4_ = fVar134;
  auVar165._8_4_ = fVar134;
  auVar165._12_4_ = fVar134;
  auVar165._16_4_ = fVar134;
  auVar165._20_4_ = fVar134;
  auVar165._24_4_ = fVar134;
  auVar165._28_4_ = fVar134;
  auVar187._8_4_ = 1;
  auVar187._0_8_ = 0x100000001;
  auVar187._12_4_ = 1;
  auVar187._16_4_ = 1;
  auVar187._20_4_ = 1;
  auVar187._24_4_ = 1;
  auVar187._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = ZEXT1632(CONCAT412(fVar152 * auVar85._12_4_,
                                CONCAT48(fVar152 * auVar85._8_4_,
                                         CONCAT44(fVar152 * auVar85._4_4_,fVar134))));
  auVar99 = vpermps_avx2(auVar187,auVar100);
  auVar89 = vpermps_avx512vl(auVar88,auVar100);
  fVar135 = auVar89._0_4_;
  fVar142 = auVar89._4_4_;
  auVar100._4_4_ = fVar142 * auVar92._4_4_;
  auVar100._0_4_ = fVar135 * auVar92._0_4_;
  fVar168 = auVar89._8_4_;
  auVar100._8_4_ = fVar168 * auVar92._8_4_;
  fVar170 = auVar89._12_4_;
  auVar100._12_4_ = fVar170 * auVar92._12_4_;
  fVar80 = auVar89._16_4_;
  auVar100._16_4_ = fVar80 * auVar92._16_4_;
  fVar81 = auVar89._20_4_;
  auVar100._20_4_ = fVar81 * auVar92._20_4_;
  fVar126 = auVar89._24_4_;
  auVar100._24_4_ = fVar126 * auVar92._24_4_;
  auVar100._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar96._4_4_ * fVar142;
  auVar97._0_4_ = auVar96._0_4_ * fVar135;
  auVar97._8_4_ = auVar96._8_4_ * fVar168;
  auVar97._12_4_ = auVar96._12_4_ * fVar170;
  auVar97._16_4_ = auVar96._16_4_ * fVar80;
  auVar97._20_4_ = auVar96._20_4_ * fVar81;
  auVar97._24_4_ = auVar96._24_4_ * fVar126;
  auVar97._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar98._4_4_ * fVar142;
  auVar90._0_4_ = auVar98._0_4_ * fVar135;
  auVar90._8_4_ = auVar98._8_4_ * fVar168;
  auVar90._12_4_ = auVar98._12_4_ * fVar170;
  auVar90._16_4_ = auVar98._16_4_ * fVar80;
  auVar90._20_4_ = auVar98._20_4_ * fVar81;
  auVar90._24_4_ = auVar98._24_4_ * fVar126;
  auVar90._28_4_ = auVar89._28_4_;
  auVar82 = vfmadd231ps_fma(auVar100,auVar99,auVar91);
  auVar83 = vfmadd231ps_fma(auVar97,auVar99,auVar95);
  auVar84 = vfmadd231ps_fma(auVar90,auVar102,auVar99);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar165,auVar94);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar165,auVar93);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar103,auVar165);
  auVar182._4_4_ = fVar151;
  auVar182._0_4_ = fVar151;
  auVar182._8_4_ = fVar151;
  auVar182._12_4_ = fVar151;
  auVar182._16_4_ = fVar151;
  auVar182._20_4_ = fVar151;
  auVar182._24_4_ = fVar151;
  auVar182._28_4_ = fVar151;
  auVar90 = ZEXT1632(CONCAT412(fVar152 * auVar86._12_4_,
                               CONCAT48(fVar152 * auVar86._8_4_,
                                        CONCAT44(fVar152 * auVar86._4_4_,fVar151))));
  auVar97 = vpermps_avx2(auVar187,auVar90);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  fVar152 = auVar90._0_4_;
  fVar135 = auVar90._4_4_;
  auVar99._4_4_ = fVar135 * auVar92._4_4_;
  auVar99._0_4_ = fVar152 * auVar92._0_4_;
  fVar142 = auVar90._8_4_;
  auVar99._8_4_ = fVar142 * auVar92._8_4_;
  fVar168 = auVar90._12_4_;
  auVar99._12_4_ = fVar168 * auVar92._12_4_;
  fVar170 = auVar90._16_4_;
  auVar99._16_4_ = fVar170 * auVar92._16_4_;
  fVar80 = auVar90._20_4_;
  auVar99._20_4_ = fVar80 * auVar92._20_4_;
  fVar81 = auVar90._24_4_;
  auVar99._24_4_ = fVar81 * auVar92._24_4_;
  auVar99._28_4_ = fVar134;
  auVar88._4_4_ = auVar96._4_4_ * fVar135;
  auVar88._0_4_ = auVar96._0_4_ * fVar152;
  auVar88._8_4_ = auVar96._8_4_ * fVar142;
  auVar88._12_4_ = auVar96._12_4_ * fVar168;
  auVar88._16_4_ = auVar96._16_4_ * fVar170;
  auVar88._20_4_ = auVar96._20_4_ * fVar80;
  auVar88._24_4_ = auVar96._24_4_ * fVar81;
  auVar88._28_4_ = auVar92._28_4_;
  auVar96._4_4_ = auVar98._4_4_ * fVar135;
  auVar96._0_4_ = auVar98._0_4_ * fVar152;
  auVar96._8_4_ = auVar98._8_4_ * fVar142;
  auVar96._12_4_ = auVar98._12_4_ * fVar168;
  auVar96._16_4_ = auVar98._16_4_ * fVar170;
  auVar96._20_4_ = auVar98._20_4_ * fVar80;
  auVar96._24_4_ = auVar98._24_4_ * fVar81;
  auVar96._28_4_ = auVar90._28_4_;
  auVar6 = vfmadd231ps_fma(auVar99,auVar97,auVar91);
  auVar7 = vfmadd231ps_fma(auVar88,auVar97,auVar95);
  auVar8 = vfmadd231ps_fma(auVar96,auVar97,auVar102);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar182,auVar94);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar182,auVar93);
  auVar174._8_4_ = 0x7fffffff;
  auVar174._0_8_ = 0x7fffffff7fffffff;
  auVar174._12_4_ = 0x7fffffff;
  auVar174._16_4_ = 0x7fffffff;
  auVar174._20_4_ = 0x7fffffff;
  auVar174._24_4_ = 0x7fffffff;
  auVar174._28_4_ = 0x7fffffff;
  auVar144 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar182,auVar103);
  auVar94 = vandps_avx(auVar174,ZEXT1632(auVar82));
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  auVar171._16_4_ = 0x219392ef;
  auVar171._20_4_ = 0x219392ef;
  auVar171._24_4_ = 0x219392ef;
  auVar171._28_4_ = 0x219392ef;
  uVar73 = vcmpps_avx512vl(auVar94,auVar171,1);
  bVar18 = (bool)((byte)uVar73 & 1);
  auVar89._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar82._0_4_;
  bVar18 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar82._4_4_;
  bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar82._8_4_;
  bVar18 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar82._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(auVar174,ZEXT1632(auVar83));
  uVar73 = vcmpps_avx512vl(auVar94,auVar171,1);
  bVar18 = (bool)((byte)uVar73 & 1);
  auVar101._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar83._0_4_;
  bVar18 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar83._4_4_;
  bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar83._8_4_;
  bVar18 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar83._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(auVar174,ZEXT1632(auVar84));
  uVar73 = vcmpps_avx512vl(auVar94,auVar171,1);
  bVar18 = (bool)((byte)uVar73 & 1);
  auVar94._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar84._0_4_;
  bVar18 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar84._4_4_;
  bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar84._8_4_;
  bVar18 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar84._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar93 = vfnmadd213ps_avx512vl(auVar89,auVar91,auVar92);
  auVar82 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar101);
  auVar93 = vfnmadd213ps_avx512vl(auVar101,auVar91,auVar92);
  auVar83 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar94);
  auVar94 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar92);
  auVar84 = vfmadd132ps_fma(auVar94,auVar91,auVar91);
  fVar152 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar169._4_4_ = fVar152;
  auVar169._0_4_ = fVar152;
  auVar169._8_4_ = fVar152;
  auVar169._12_4_ = fVar152;
  auVar169._16_4_ = fVar152;
  auVar169._20_4_ = fVar152;
  auVar169._24_4_ = fVar152;
  auVar169._28_4_ = fVar152;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0xb + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar94);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar6 = vfmadd213ps_fma(auVar91,auVar169,auVar94);
  auVar94 = vcvtdq2ps_avx(auVar92);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0xd + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar94);
  auVar7 = vfmadd213ps_fma(auVar91,auVar169,auVar94);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x12 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar73 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 2 + uVar73 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar94);
  auVar8 = vfmadd213ps_fma(auVar91,auVar169,auVar94);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x18 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar94);
  auVar9 = vfmadd213ps_fma(auVar91,auVar169,auVar94);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x1d + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar94);
  auVar10 = vfmadd213ps_fma(auVar91,auVar169,auVar94);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar12 * 0x20 - uVar71) + 6))
  ;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x23 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,auVar94);
  auVar11 = vfmadd213ps_fma(auVar91,auVar169,auVar94);
  auVar94 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar85));
  auVar103._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar103._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar103._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar103._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar103._16_4_ = auVar94._16_4_ * 0.0;
  auVar103._20_4_ = auVar94._20_4_ * 0.0;
  auVar103._24_4_ = auVar94._24_4_ * 0.0;
  auVar103._28_4_ = auVar94._28_4_;
  auVar94 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar85));
  auVar149._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar149._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar149._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar149._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar149._16_4_ = auVar94._16_4_ * 0.0;
  auVar149._20_4_ = auVar94._20_4_ * 0.0;
  auVar149._24_4_ = auVar94._24_4_ * 0.0;
  auVar149._28_4_ = 0;
  auVar94 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar86));
  auVar102._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar102._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar102._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar102._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar102._16_4_ = auVar94._16_4_ * 0.0;
  auVar102._20_4_ = auVar94._20_4_ * 0.0;
  auVar102._24_4_ = auVar94._24_4_ * 0.0;
  auVar102._28_4_ = auVar94._28_4_;
  auVar94 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar86));
  auVar145._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar145._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar145._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar145._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar145._16_4_ = auVar94._16_4_ * 0.0;
  auVar145._20_4_ = auVar94._20_4_ * 0.0;
  auVar145._24_4_ = auVar94._24_4_ * 0.0;
  auVar145._28_4_ = 0;
  auVar94 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar144));
  auVar98._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar98._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar98._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar98._16_4_ = auVar94._16_4_ * 0.0;
  auVar98._20_4_ = auVar94._20_4_ * 0.0;
  auVar98._24_4_ = auVar94._24_4_ * 0.0;
  auVar98._28_4_ = auVar94._28_4_;
  auVar94 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar144));
  auVar115._0_4_ = auVar84._0_4_ * auVar94._0_4_;
  auVar115._4_4_ = auVar84._4_4_ * auVar94._4_4_;
  auVar115._8_4_ = auVar84._8_4_ * auVar94._8_4_;
  auVar115._12_4_ = auVar84._12_4_ * auVar94._12_4_;
  auVar115._16_4_ = auVar94._16_4_ * 0.0;
  auVar115._20_4_ = auVar94._20_4_ * 0.0;
  auVar115._24_4_ = auVar94._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar103,auVar149);
  auVar91 = vpminsd_avx2(auVar102,auVar145);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91 = vpminsd_avx2(auVar98,auVar115);
  uVar136 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar92._4_4_ = uVar136;
  auVar92._0_4_ = uVar136;
  auVar92._8_4_ = uVar136;
  auVar92._12_4_ = uVar136;
  auVar92._16_4_ = uVar136;
  auVar92._20_4_ = uVar136;
  auVar92._24_4_ = uVar136;
  auVar92._28_4_ = uVar136;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar94,auVar91);
  auVar94 = vpmaxsd_avx2(auVar103,auVar149);
  auVar91 = vpmaxsd_avx2(auVar102,auVar145);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar91 = vpmaxsd_avx2(auVar98,auVar115);
  uVar136 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar93._4_4_ = uVar136;
  auVar93._0_4_ = uVar136;
  auVar93._8_4_ = uVar136;
  auVar93._12_4_ = uVar136;
  auVar93._16_4_ = uVar136;
  auVar93._20_4_ = uVar136;
  auVar93._24_4_ = uVar136;
  auVar93._28_4_ = uVar136;
  auVar91 = vminps_avx512vl(auVar91,auVar93);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar95);
  auVar91 = vpbroadcastd_avx512vl();
  uVar26 = vpcmpgtd_avx512vl(auVar91,_DAT_01fe9900);
  uVar143 = vcmpps_avx512vl(local_80,auVar94,2);
  if ((byte)((byte)uVar143 & (byte)uVar26) == 0) {
    bVar79 = 0;
  }
  else {
    uVar73 = (ulong)(byte)((byte)uVar143 & (byte)uVar26);
    local_5d0 = pre->ray_space + k;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5c8 = prim;
    do {
      lVar27 = 0;
      for (uVar71 = uVar73; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar13 = *(uint *)(local_5c8 + 2);
      pGVar15 = (context->scene->geometries).items[uVar13].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_5c8 + lVar27 * 4 + 6));
      uVar71 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                               CONCAT44(0,*(uint *)(local_5c8 + lVar27 * 4 + 6)) *
                               pGVar15[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar152 = (pGVar15->time_range).lower;
      fVar152 = pGVar15->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar152) /
                ((pGVar15->time_range).upper - fVar152));
      auVar82 = vroundss_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),9);
      auVar82 = vminss_avx(auVar82,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar82 = vmaxss_avx(ZEXT816(0) << 0x20,auVar82);
      fVar152 = fVar152 - auVar82._0_4_;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar74 = (long)(int)auVar82._0_4_ * 0x38;
      lVar27 = *(long *)(_Var16 + 0x10 + lVar74);
      lVar78 = *(long *)(_Var16 + 0x38 + lVar74);
      lVar72 = *(long *)(_Var16 + 0x48 + lVar74);
      auVar86._4_4_ = fVar152;
      auVar86._0_4_ = fVar152;
      auVar86._8_4_ = fVar152;
      auVar86._12_4_ = fVar152;
      pfVar3 = (float *)(lVar78 + uVar71 * lVar72);
      auVar173._0_4_ = fVar152 * *pfVar3;
      auVar173._4_4_ = fVar152 * pfVar3[1];
      auVar173._8_4_ = fVar152 * pfVar3[2];
      auVar173._12_4_ = fVar152 * pfVar3[3];
      pfVar3 = (float *)(lVar78 + (uVar71 + 1) * lVar72);
      auVar176._0_4_ = fVar152 * *pfVar3;
      auVar176._4_4_ = fVar152 * pfVar3[1];
      auVar176._8_4_ = fVar152 * pfVar3[2];
      auVar176._12_4_ = fVar152 * pfVar3[3];
      uVar75 = (uVar71 + 2) * lVar72;
      auVar82 = vmulps_avx512vl(auVar86,*(undefined1 (*) [16])(lVar78 + uVar75));
      auVar83 = vmulps_avx512vl(auVar86,*(undefined1 (*) [16])(lVar78 + lVar72 * (uVar71 + 3)));
      lVar78 = *(long *)(_Var16 + lVar74);
      fVar152 = 1.0 - fVar152;
      auVar85._4_4_ = fVar152;
      auVar85._0_4_ = fVar152;
      auVar85._8_4_ = fVar152;
      auVar85._12_4_ = fVar152;
      local_670 = vfmadd231ps_fma(auVar173,auVar85,*(undefined1 (*) [16])(lVar78 + lVar27 * uVar71))
      ;
      local_680 = vfmadd231ps_fma(auVar176,auVar85,
                                  *(undefined1 (*) [16])(lVar78 + lVar27 * (uVar71 + 1)));
      local_690 = vfmadd231ps_avx512vl
                            (auVar82,auVar85,*(undefined1 (*) [16])(lVar78 + lVar27 * (uVar71 + 2)))
      ;
      _local_4d0 = vfmadd231ps_avx512vl
                             (auVar83,auVar85,*(undefined1 (*) [16])(lVar78 + lVar27 * (uVar71 + 3))
                             );
      iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar27 = (long)iVar14 * 0x44;
      auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar84 = vsubps_avx(local_670,auVar82);
      uVar136 = auVar84._0_4_;
      auVar87._4_4_ = uVar136;
      auVar87._0_4_ = uVar136;
      auVar87._8_4_ = uVar136;
      auVar87._12_4_ = uVar136;
      auVar83 = vshufps_avx(auVar84,auVar84,0x55);
      aVar4 = (local_5d0->vx).field_0;
      aVar5 = (local_5d0->vy).field_0;
      fVar152 = (local_5d0->vz).field_0.m128[0];
      fVar134 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
      fVar135 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
      fVar142 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar178._0_4_ = fVar152 * auVar84._0_4_;
      auVar178._4_4_ = fVar134 * auVar84._4_4_;
      auVar178._8_4_ = fVar135 * auVar84._8_4_;
      auVar178._12_4_ = fVar142 * auVar84._12_4_;
      auVar83 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar5,auVar83);
      auVar6 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar87);
      auVar84 = vsubps_avx(local_680,auVar82);
      uVar136 = auVar84._0_4_;
      auVar147._4_4_ = uVar136;
      auVar147._0_4_ = uVar136;
      auVar147._8_4_ = uVar136;
      auVar147._12_4_ = uVar136;
      auVar83 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar179._0_4_ = fVar152 * auVar84._0_4_;
      auVar179._4_4_ = fVar134 * auVar84._4_4_;
      auVar179._8_4_ = fVar135 * auVar84._8_4_;
      auVar179._12_4_ = fVar142 * auVar84._12_4_;
      auVar83 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar83);
      auVar7 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar147);
      auVar84 = vsubps_avx512vl(local_690,auVar82);
      uVar136 = auVar84._0_4_;
      auVar148._4_4_ = uVar136;
      auVar148._0_4_ = uVar136;
      auVar148._8_4_ = uVar136;
      auVar148._12_4_ = uVar136;
      auVar83 = vshufps_avx(auVar84,auVar84,0x55);
      auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar180._0_4_ = fVar152 * auVar84._0_4_;
      auVar180._4_4_ = fVar134 * auVar84._4_4_;
      auVar180._8_4_ = fVar135 * auVar84._8_4_;
      auVar180._12_4_ = fVar142 * auVar84._12_4_;
      auVar83 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar83);
      auVar84 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar148);
      auVar83 = vsubps_avx512vl(_local_4d0,auVar82);
      uVar136 = auVar83._0_4_;
      auVar144._4_4_ = uVar136;
      auVar144._0_4_ = uVar136;
      auVar144._8_4_ = uVar136;
      auVar144._12_4_ = uVar136;
      auVar82 = vshufps_avx(auVar83,auVar83,0x55);
      auVar83 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar186._0_4_ = fVar152 * auVar83._0_4_;
      auVar186._4_4_ = fVar134 * auVar83._4_4_;
      auVar186._8_4_ = fVar135 * auVar83._8_4_;
      auVar186._12_4_ = fVar142 * auVar83._12_4_;
      auVar82 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar82);
      auVar8 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar144);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar136 = auVar6._0_4_;
      local_540._4_4_ = uVar136;
      local_540._0_4_ = uVar136;
      local_540._8_4_ = uVar136;
      local_540._12_4_ = uVar136;
      local_540._16_4_ = uVar136;
      local_540._20_4_ = uVar136;
      local_540._24_4_ = uVar136;
      local_540._28_4_ = uVar136;
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar141._8_4_ = 1;
      auVar141._0_8_ = 0x100000001;
      auVar141._12_4_ = 1;
      auVar141._16_4_ = 1;
      auVar141._20_4_ = 1;
      auVar141._24_4_ = 1;
      auVar141._28_4_ = 1;
      local_500 = vpermps_avx2(auVar141,ZEXT1632(auVar6));
      local_560 = vbroadcastss_avx512vl(auVar7);
      local_580 = vpermps_avx2(auVar141,ZEXT1632(auVar7));
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_6c0 = vbroadcastss_avx512vl(auVar84);
      local_660 = vpermps_avx512vl(auVar141,ZEXT1632(auVar84));
      auVar197 = ZEXT3264(local_660);
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      local_620 = vbroadcastss_avx512vl(auVar8);
      auVar200 = ZEXT3264(local_620);
      local_640 = vpermps_avx512vl(auVar141,ZEXT1632(auVar8));
      auVar199 = ZEXT3264(local_640);
      auVar95 = vmulps_avx512vl(local_620,auVar93);
      auVar96 = vmulps_avx512vl(local_640,auVar93);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_6c0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_660);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_560);
      auVar82 = vfmadd231ps_fma(auVar96,auVar91,local_580);
      auVar97 = vfmadd231ps_avx512vl(auVar95,auVar94,local_540);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar94,local_500);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar98 = vmulps_avx512vl(local_620,auVar102);
      auVar99 = vmulps_avx512vl(local_640,auVar102);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_6c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_660);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_560);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_580);
      auVar9 = vfmadd231ps_fma(auVar98,auVar95,local_540);
      auVar10 = vfmadd231ps_fma(auVar99,auVar95,local_500);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar9),auVar97);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar10),auVar90);
      auVar98 = vmulps_avx512vl(auVar90,auVar99);
      auVar88 = vmulps_avx512vl(auVar97,auVar100);
      auVar98 = vsubps_avx512vl(auVar98,auVar88);
      auVar82 = vshufps_avx(local_670,local_670,0xff);
      uVar143 = auVar82._0_8_;
      local_a0._8_8_ = uVar143;
      local_a0._0_8_ = uVar143;
      local_a0._16_8_ = uVar143;
      local_a0._24_8_ = uVar143;
      auVar82 = vshufps_avx(local_680,local_680,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(local_690,local_690,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar82);
      auVar82 = vshufps_avx512vl(_local_4d0,_local_4d0,0xff);
      uVar143 = auVar82._0_8_;
      register0x000012c8 = uVar143;
      local_100 = uVar143;
      register0x000012d0 = uVar143;
      register0x000012d8 = uVar143;
      auVar88 = vmulps_avx512vl(_local_100,auVar93);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar92,local_e0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,local_c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_a0);
      auVar89 = vmulps_avx512vl(_local_100,auVar102);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,local_e0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_c0);
      auVar11 = vfmadd231ps_fma(auVar89,auVar95,local_a0);
      auVar89 = vmulps_avx512vl(auVar100,auVar100);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar99,auVar99);
      auVar101 = vmaxps_avx512vl(auVar88,ZEXT1632(auVar11));
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      auVar89 = vmulps_avx512vl(auVar101,auVar89);
      auVar98 = vmulps_avx512vl(auVar98,auVar98);
      uVar143 = vcmpps_avx512vl(auVar98,auVar89,2);
      auVar82 = vblendps_avx(auVar6,local_670,8);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar83 = vandps_avx512vl(auVar82,auVar85);
      auVar82 = vblendps_avx(auVar7,local_680,8);
      auVar82 = vandps_avx512vl(auVar82,auVar85);
      auVar83 = vmaxps_avx(auVar83,auVar82);
      auVar82 = vblendps_avx(auVar84,local_690,8);
      auVar86 = vandps_avx512vl(auVar82,auVar85);
      auVar82 = vblendps_avx(auVar8,_local_4d0,8);
      auVar82 = vandps_avx512vl(auVar82,auVar85);
      auVar82 = vmaxps_avx(auVar86,auVar82);
      auVar82 = vmaxps_avx(auVar83,auVar82);
      auVar83 = vmovshdup_avx(auVar82);
      auVar83 = vmaxss_avx(auVar83,auVar82);
      auVar82 = vshufpd_avx(auVar82,auVar82,1);
      auVar82 = vmaxss_avx(auVar82,auVar83);
      auVar83 = vcvtsi2ss_avx512f(local_690,iVar14);
      local_460._0_16_ = auVar83;
      auVar175._0_4_ = auVar83._0_4_;
      auVar175._4_4_ = auVar175._0_4_;
      auVar175._8_4_ = auVar175._0_4_;
      auVar175._12_4_ = auVar175._0_4_;
      auVar175._16_4_ = auVar175._0_4_;
      auVar175._20_4_ = auVar175._0_4_;
      auVar175._24_4_ = auVar175._0_4_;
      auVar175._28_4_ = auVar175._0_4_;
      uVar26 = vcmpps_avx512vl(auVar175,_DAT_01faff40,0xe);
      bVar79 = (byte)uVar143 & (byte)uVar26;
      auVar82 = vmulss_avx512f(auVar82,ZEXT416(0x35000000));
      auVar150._8_4_ = 2;
      auVar150._0_8_ = 0x200000002;
      auVar150._12_4_ = 2;
      auVar150._16_4_ = 2;
      auVar150._20_4_ = 2;
      auVar150._24_4_ = 2;
      auVar150._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar150,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar150,ZEXT1632(auVar7));
      local_160 = vpermps_avx512vl(auVar150,ZEXT1632(auVar84));
      auVar98 = vpermps_avx2(auVar150,ZEXT1632(auVar8));
      uVar77 = *(uint *)(ray + k * 4 + 0x60);
      local_400 = auVar82._0_4_;
      uStack_3fc = auVar82._4_4_;
      uStack_3f8 = auVar82._8_4_;
      uStack_3f4 = auVar82._12_4_;
      auVar83 = auVar100._0_16_;
      if (bVar79 == 0) {
        uVar75 = 0;
        auVar82 = vxorps_avx512vl(auVar83,auVar83);
        auVar196 = ZEXT1664(auVar82);
        auVar193 = ZEXT3264(local_540);
        auVar194 = ZEXT3264(local_500);
        auVar195 = ZEXT3264(local_560);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar198 = ZEXT3264(auVar94);
        auVar192 = ZEXT3264(local_580);
        auVar191 = ZEXT3264(local_6c0);
      }
      else {
        local_5c0._0_16_ = ZEXT416(uVar77);
        auVar102 = vmulps_avx512vl(auVar98,auVar102);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar103);
        auVar96 = vfmadd213ps_avx512vl(auVar95,local_120,auVar96);
        auVar93 = vmulps_avx512vl(auVar98,auVar93);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar93);
        auVar103 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar103 = vfmadd213ps_avx512vl(auVar94,local_120,auVar103);
        auVar94 = vmulps_avx512vl(local_620,auVar95);
        auVar102 = vmulps_avx512vl(local_640,auVar95);
        auVar181._0_4_ = auVar98._0_4_ * auVar95._0_4_;
        auVar181._4_4_ = auVar98._4_4_ * auVar95._4_4_;
        auVar181._8_4_ = auVar98._8_4_ * auVar95._8_4_;
        auVar181._12_4_ = auVar98._12_4_ * auVar95._12_4_;
        auVar181._16_4_ = auVar98._16_4_ * auVar95._16_4_;
        auVar181._20_4_ = auVar98._20_4_ * auVar95._20_4_;
        auVar181._24_4_ = auVar98._24_4_ * auVar95._24_4_;
        auVar181._28_4_ = 0;
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,local_6c0);
        auVar95 = vfmadd231ps_avx512vl(auVar102,auVar93,local_660);
        auVar93 = vfmadd231ps_avx512vl(auVar181,local_160,auVar93);
        auVar84 = vfmadd231ps_fma(auVar94,auVar92,local_560);
        auVar192 = ZEXT3264(local_580);
        auVar94 = vfmadd231ps_avx512vl(auVar95,auVar92,local_580);
        auVar95 = vfmadd231ps_avx512vl(auVar93,local_140,auVar92);
        auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar91,local_540);
        auVar89 = vfmadd231ps_avx512vl(auVar94,auVar91,local_500);
        auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_120,auVar91);
        auVar91 = vmulps_avx512vl(local_620,auVar93);
        auVar101 = vmulps_avx512vl(local_640,auVar93);
        auVar33._4_4_ = auVar98._4_4_ * auVar93._4_4_;
        auVar33._0_4_ = auVar98._0_4_ * auVar93._0_4_;
        auVar33._8_4_ = auVar98._8_4_ * auVar93._8_4_;
        auVar33._12_4_ = auVar98._12_4_ * auVar93._12_4_;
        auVar33._16_4_ = auVar98._16_4_ * auVar93._16_4_;
        auVar33._20_4_ = auVar98._20_4_ * auVar93._20_4_;
        auVar33._24_4_ = auVar98._24_4_ * auVar93._24_4_;
        auVar33._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd231ps_avx512vl(auVar91,auVar92,local_6c0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,local_660);
        auVar92 = vfmadd231ps_avx512vl(auVar33,local_160,auVar92);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_560);
        auVar195 = ZEXT3264(local_560);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,local_580);
        auVar91 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar94,local_540);
        auVar93 = vfmadd231ps_avx512vl(auVar101,auVar94,local_500);
        auVar101 = vfmadd231ps_avx512vl(auVar91,local_120,auVar94);
        auVar188._8_4_ = 0x7fffffff;
        auVar188._0_8_ = 0x7fffffff7fffffff;
        auVar188._12_4_ = 0x7fffffff;
        auVar188._16_4_ = 0x7fffffff;
        auVar188._20_4_ = 0x7fffffff;
        auVar188._24_4_ = 0x7fffffff;
        auVar188._28_4_ = 0x7fffffff;
        auVar94 = vandps_avx(auVar102,auVar188);
        auVar91 = vandps_avx(auVar89,auVar188);
        auVar91 = vmaxps_avx(auVar94,auVar91);
        auVar94 = vandps_avx(auVar95,auVar188);
        auVar94 = vmaxps_avx(auVar91,auVar94);
        auVar95 = vbroadcastss_avx512vl(auVar82);
        uVar71 = vcmpps_avx512vl(auVar94,auVar95,1);
        bVar18 = (bool)((byte)uVar71 & 1);
        auVar104._0_4_ = (float)((uint)bVar18 * auVar99._0_4_ | (uint)!bVar18 * auVar102._0_4_);
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar102._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar102._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar102._12_4_);
        bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar18 * auVar99._16_4_ | (uint)!bVar18 * auVar102._16_4_);
        bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar18 * auVar99._20_4_ | (uint)!bVar18 * auVar102._20_4_);
        bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar18 * auVar99._24_4_ | (uint)!bVar18 * auVar102._24_4_);
        bVar18 = SUB81(uVar71 >> 7,0);
        auVar104._28_4_ = (uint)bVar18 * auVar99._28_4_ | (uint)!bVar18 * auVar102._28_4_;
        bVar18 = (bool)((byte)uVar71 & 1);
        auVar105._0_4_ = (float)((uint)bVar18 * auVar100._0_4_ | (uint)!bVar18 * auVar89._0_4_);
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar89._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar89._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar89._12_4_);
        bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * auVar89._16_4_);
        bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * auVar89._20_4_);
        bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * auVar89._24_4_);
        bVar18 = SUB81(uVar71 >> 7,0);
        auVar105._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar89._28_4_;
        auVar94 = vandps_avx(auVar188,auVar92);
        auVar91 = vandps_avx(auVar93,auVar188);
        auVar91 = vmaxps_avx(auVar94,auVar91);
        auVar94 = vandps_avx(auVar101,auVar188);
        auVar94 = vmaxps_avx(auVar91,auVar94);
        uVar71 = vcmpps_avx512vl(auVar94,auVar95,1);
        bVar18 = (bool)((byte)uVar71 & 1);
        auVar106._0_4_ = (float)((uint)bVar18 * auVar99._0_4_ | (uint)!bVar18 * auVar92._0_4_);
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar92._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar92._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar92._12_4_);
        bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar18 * auVar99._16_4_ | (uint)!bVar18 * auVar92._16_4_);
        bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar18 * auVar99._20_4_ | (uint)!bVar18 * auVar92._20_4_);
        bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar18 * auVar99._24_4_ | (uint)!bVar18 * auVar92._24_4_);
        bVar18 = SUB81(uVar71 >> 7,0);
        auVar106._28_4_ = (uint)bVar18 * auVar99._28_4_ | (uint)!bVar18 * auVar92._28_4_;
        bVar18 = (bool)((byte)uVar71 & 1);
        auVar107._0_4_ = (float)((uint)bVar18 * auVar100._0_4_ | (uint)!bVar18 * auVar93._0_4_);
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * auVar93._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * auVar93._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * auVar93._12_4_);
        bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * auVar93._16_4_);
        bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * auVar93._20_4_);
        bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * auVar93._24_4_);
        bVar18 = SUB81(uVar71 >> 7,0);
        auVar107._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * auVar93._28_4_;
        auVar87 = vxorps_avx512vl(auVar83,auVar83);
        auVar196 = ZEXT1664(auVar87);
        auVar94 = vfmadd213ps_avx512vl(auVar104,auVar104,ZEXT1632(auVar87));
        auVar82 = vfmadd231ps_fma(auVar94,auVar105,auVar105);
        auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar152 = auVar94._0_4_;
        fVar134 = auVar94._4_4_;
        fVar135 = auVar94._8_4_;
        fVar142 = auVar94._12_4_;
        fVar168 = auVar94._16_4_;
        fVar170 = auVar94._20_4_;
        fVar80 = auVar94._24_4_;
        auVar34._4_4_ = fVar134 * fVar134 * fVar134 * auVar82._4_4_ * -0.5;
        auVar34._0_4_ = fVar152 * fVar152 * fVar152 * auVar82._0_4_ * -0.5;
        auVar34._8_4_ = fVar135 * fVar135 * fVar135 * auVar82._8_4_ * -0.5;
        auVar34._12_4_ = fVar142 * fVar142 * fVar142 * auVar82._12_4_ * -0.5;
        auVar34._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar34._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar34._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar34._28_4_ = auVar101._28_4_;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar94 = vfmadd231ps_avx512vl(auVar34,auVar91,auVar94);
        auVar35._4_4_ = auVar105._4_4_ * auVar94._4_4_;
        auVar35._0_4_ = auVar105._0_4_ * auVar94._0_4_;
        auVar35._8_4_ = auVar105._8_4_ * auVar94._8_4_;
        auVar35._12_4_ = auVar105._12_4_ * auVar94._12_4_;
        auVar35._16_4_ = auVar105._16_4_ * auVar94._16_4_;
        auVar35._20_4_ = auVar105._20_4_ * auVar94._20_4_;
        auVar35._24_4_ = auVar105._24_4_ * auVar94._24_4_;
        auVar35._28_4_ = 0;
        auVar36._4_4_ = auVar94._4_4_ * -auVar104._4_4_;
        auVar36._0_4_ = auVar94._0_4_ * -auVar104._0_4_;
        auVar36._8_4_ = auVar94._8_4_ * -auVar104._8_4_;
        auVar36._12_4_ = auVar94._12_4_ * -auVar104._12_4_;
        auVar36._16_4_ = auVar94._16_4_ * -auVar104._16_4_;
        auVar36._20_4_ = auVar94._20_4_ * -auVar104._20_4_;
        auVar36._24_4_ = auVar94._24_4_ * -auVar104._24_4_;
        auVar36._28_4_ = auVar105._28_4_;
        auVar94 = vmulps_avx512vl(auVar94,ZEXT1632(auVar87));
        auVar99 = ZEXT1632(auVar87);
        auVar92 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar99);
        auVar82 = vfmadd231ps_fma(auVar92,auVar107,auVar107);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
        fVar152 = auVar92._0_4_;
        fVar134 = auVar92._4_4_;
        fVar135 = auVar92._8_4_;
        fVar142 = auVar92._12_4_;
        fVar168 = auVar92._16_4_;
        fVar170 = auVar92._20_4_;
        fVar80 = auVar92._24_4_;
        auVar37._4_4_ = fVar134 * fVar134 * fVar134 * auVar82._4_4_ * -0.5;
        auVar37._0_4_ = fVar152 * fVar152 * fVar152 * auVar82._0_4_ * -0.5;
        auVar37._8_4_ = fVar135 * fVar135 * fVar135 * auVar82._8_4_ * -0.5;
        auVar37._12_4_ = fVar142 * fVar142 * fVar142 * auVar82._12_4_ * -0.5;
        auVar37._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
        auVar37._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar37._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
        auVar37._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar37,auVar91,auVar92);
        auVar38._4_4_ = auVar107._4_4_ * auVar91._4_4_;
        auVar38._0_4_ = auVar107._0_4_ * auVar91._0_4_;
        auVar38._8_4_ = auVar107._8_4_ * auVar91._8_4_;
        auVar38._12_4_ = auVar107._12_4_ * auVar91._12_4_;
        auVar38._16_4_ = auVar107._16_4_ * auVar91._16_4_;
        auVar38._20_4_ = auVar107._20_4_ * auVar91._20_4_;
        auVar38._24_4_ = auVar107._24_4_ * auVar91._24_4_;
        auVar38._28_4_ = auVar92._28_4_;
        auVar39._4_4_ = -auVar106._4_4_ * auVar91._4_4_;
        auVar39._0_4_ = -auVar106._0_4_ * auVar91._0_4_;
        auVar39._8_4_ = -auVar106._8_4_ * auVar91._8_4_;
        auVar39._12_4_ = -auVar106._12_4_ * auVar91._12_4_;
        auVar39._16_4_ = -auVar106._16_4_ * auVar91._16_4_;
        auVar39._20_4_ = -auVar106._20_4_ * auVar91._20_4_;
        auVar39._24_4_ = -auVar106._24_4_ * auVar91._24_4_;
        auVar39._28_4_ = auVar106._28_4_ ^ 0x80000000;
        auVar91 = vmulps_avx512vl(auVar91,auVar99);
        auVar82 = vfmadd213ps_fma(auVar35,auVar88,auVar97);
        auVar83 = vfmadd213ps_fma(auVar36,auVar88,auVar90);
        auVar92 = vfmadd213ps_avx512vl(auVar94,auVar88,auVar103);
        auVar93 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar11),ZEXT1632(auVar9));
        auVar85 = vfnmadd213ps_fma(auVar35,auVar88,auVar97);
        auVar102 = ZEXT1632(auVar11);
        auVar84 = vfmadd213ps_fma(auVar39,auVar102,ZEXT1632(auVar10));
        auVar86 = vfnmadd213ps_fma(auVar36,auVar88,auVar90);
        auVar6 = vfmadd213ps_fma(auVar91,auVar102,auVar96);
        auVar95 = vfnmadd231ps_avx512vl(auVar103,auVar88,auVar94);
        auVar9 = vfnmadd213ps_fma(auVar38,auVar102,ZEXT1632(auVar9));
        auVar10 = vfnmadd213ps_fma(auVar39,auVar102,ZEXT1632(auVar10));
        auVar144 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar11),auVar91);
        auVar91 = vsubps_avx512vl(auVar93,ZEXT1632(auVar85));
        auVar94 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar86));
        auVar96 = vsubps_avx512vl(ZEXT1632(auVar6),auVar95);
        auVar103 = vmulps_avx512vl(auVar94,auVar95);
        auVar7 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar86),auVar96);
        auVar40._4_4_ = auVar85._4_4_ * auVar96._4_4_;
        auVar40._0_4_ = auVar85._0_4_ * auVar96._0_4_;
        auVar40._8_4_ = auVar85._8_4_ * auVar96._8_4_;
        auVar40._12_4_ = auVar85._12_4_ * auVar96._12_4_;
        auVar40._16_4_ = auVar96._16_4_ * 0.0;
        auVar40._20_4_ = auVar96._20_4_ * 0.0;
        auVar40._24_4_ = auVar96._24_4_ * 0.0;
        auVar40._28_4_ = auVar96._28_4_;
        auVar96 = vfmsub231ps_avx512vl(auVar40,auVar95,auVar91);
        auVar41._4_4_ = auVar86._4_4_ * auVar91._4_4_;
        auVar41._0_4_ = auVar86._0_4_ * auVar91._0_4_;
        auVar41._8_4_ = auVar86._8_4_ * auVar91._8_4_;
        auVar41._12_4_ = auVar86._12_4_ * auVar91._12_4_;
        auVar41._16_4_ = auVar91._16_4_ * 0.0;
        auVar41._20_4_ = auVar91._20_4_ * 0.0;
        auVar41._24_4_ = auVar91._24_4_ * 0.0;
        auVar41._28_4_ = auVar91._28_4_;
        auVar8 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar85),auVar94);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar99,auVar96);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,ZEXT1632(auVar7));
        auVar100 = ZEXT1632(auVar87);
        uVar71 = vcmpps_avx512vl(auVar94,auVar100,2);
        bVar70 = (byte)uVar71;
        fVar80 = (float)((uint)(bVar70 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar9._0_4_);
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar126 = (float)((uint)bVar18 * auVar82._4_4_ | (uint)!bVar18 * auVar9._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar127 = (float)((uint)bVar18 * auVar82._8_4_ | (uint)!bVar18 * auVar9._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar130 = (float)((uint)bVar18 * auVar82._12_4_ | (uint)!bVar18 * auVar9._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar126,fVar80))));
        fVar81 = (float)((uint)(bVar70 & 1) * auVar83._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar10._0_4_);
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar151 = (float)((uint)bVar18 * auVar83._4_4_ | (uint)!bVar18 * auVar10._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar128 = (float)((uint)bVar18 * auVar83._8_4_ | (uint)!bVar18 * auVar10._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar131 = (float)((uint)bVar18 * auVar83._12_4_ | (uint)!bVar18 * auVar10._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar128,CONCAT44(fVar151,fVar81))));
        auVar108._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar144._0_4_
                    );
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar144._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar144._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar144._12_4_);
        fVar134 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar92._16_4_);
        auVar108._16_4_ = fVar134;
        fVar152 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar92._20_4_);
        auVar108._20_4_ = fVar152;
        fVar135 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar92._24_4_);
        auVar108._24_4_ = fVar135;
        iVar1 = (uint)(byte)(uVar71 >> 7) * auVar92._28_4_;
        auVar108._28_4_ = iVar1;
        auVar91 = vblendmps_avx512vl(ZEXT1632(auVar85),auVar93);
        auVar109._0_4_ =
             (uint)(bVar70 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar7._0_4_;
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar18 * auVar91._4_4_ | (uint)!bVar18 * auVar7._4_4_;
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar18 * auVar91._8_4_ | (uint)!bVar18 * auVar7._8_4_;
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar18 * auVar91._12_4_ | (uint)!bVar18 * auVar7._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_;
        auVar109._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
        auVar91 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar84));
        auVar110._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar83._0_4_)
        ;
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar18 * auVar91._4_4_ | (uint)!bVar18 * auVar83._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar18 * auVar91._8_4_ | (uint)!bVar18 * auVar83._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar18 * auVar91._12_4_ | (uint)!bVar18 * auVar83._12_4_);
        fVar142 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_);
        auVar110._16_4_ = fVar142;
        fVar168 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_);
        auVar110._20_4_ = fVar168;
        fVar170 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_);
        auVar110._24_4_ = fVar170;
        auVar110._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
        auVar91 = vblendmps_avx512vl(auVar95,ZEXT1632(auVar6));
        auVar111._0_4_ =
             (float)((uint)(bVar70 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar92._0_4_)
        ;
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar18 * auVar91._4_4_ | (uint)!bVar18 * auVar92._4_4_);
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar18 * auVar91._8_4_ | (uint)!bVar18 * auVar92._8_4_);
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar18 * auVar91._12_4_ | (uint)!bVar18 * auVar92._12_4_);
        bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar18 * auVar91._16_4_ | (uint)!bVar18 * auVar92._16_4_);
        bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar18 * auVar91._20_4_ | (uint)!bVar18 * auVar92._20_4_);
        bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar18 * auVar91._24_4_ | (uint)!bVar18 * auVar92._24_4_);
        bVar18 = SUB81(uVar71 >> 7,0);
        auVar111._28_4_ = (uint)bVar18 * auVar91._28_4_ | (uint)!bVar18 * auVar92._28_4_;
        auVar112._0_4_ =
             (uint)(bVar70 & 1) * (int)auVar85._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar18 * (int)auVar85._4_4_ | (uint)!bVar18 * auVar93._4_4_;
        bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar18 * (int)auVar85._8_4_ | (uint)!bVar18 * auVar93._8_4_;
        bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar18 * (int)auVar85._12_4_ | (uint)!bVar18 * auVar93._12_4_;
        auVar112._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_;
        auVar112._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_;
        auVar112._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_;
        auVar112._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar93._28_4_;
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._0_4_ =
             (uint)(bVar70 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar6._0_4_;
        bVar19 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar19 * auVar95._4_4_ | (uint)!bVar19 * auVar6._4_4_;
        bVar19 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar19 * auVar95._8_4_ | (uint)!bVar19 * auVar6._8_4_;
        bVar19 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar19 * auVar95._12_4_ | (uint)!bVar19 * auVar6._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar95._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar95._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar95._24_4_;
        iVar2 = (uint)(byte)(uVar71 >> 7) * auVar95._28_4_;
        auVar113._28_4_ = iVar2;
        auVar97 = vsubps_avx512vl(auVar112,auVar103);
        auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar86._12_4_ |
                                                (uint)!bVar21 * auVar84._12_4_,
                                                CONCAT48((uint)bVar20 * (int)auVar86._8_4_ |
                                                         (uint)!bVar20 * auVar84._8_4_,
                                                         CONCAT44((uint)bVar18 * (int)auVar86._4_4_
                                                                  | (uint)!bVar18 * auVar84._4_4_,
                                                                  (uint)(bVar70 & 1) *
                                                                  (int)auVar86._0_4_ |
                                                                  (uint)!(bool)(bVar70 & 1) *
                                                                  auVar84._0_4_)))),auVar102);
        auVar92 = vsubps_avx(auVar113,auVar108);
        auVar93 = vsubps_avx(auVar103,auVar109);
        auVar95 = vsubps_avx(auVar102,auVar110);
        auVar96 = vsubps_avx(auVar108,auVar111);
        auVar42._4_4_ = auVar92._4_4_ * fVar126;
        auVar42._0_4_ = auVar92._0_4_ * fVar80;
        auVar42._8_4_ = auVar92._8_4_ * fVar127;
        auVar42._12_4_ = auVar92._12_4_ * fVar130;
        auVar42._16_4_ = auVar92._16_4_ * 0.0;
        auVar42._20_4_ = auVar92._20_4_ * 0.0;
        auVar42._24_4_ = auVar92._24_4_ * 0.0;
        auVar42._28_4_ = iVar2;
        auVar82 = vfmsub231ps_fma(auVar42,auVar108,auVar97);
        auVar43._4_4_ = fVar151 * auVar97._4_4_;
        auVar43._0_4_ = fVar81 * auVar97._0_4_;
        auVar43._8_4_ = fVar128 * auVar97._8_4_;
        auVar43._12_4_ = fVar131 * auVar97._12_4_;
        auVar43._16_4_ = auVar97._16_4_ * 0.0;
        auVar43._20_4_ = auVar97._20_4_ * 0.0;
        auVar43._24_4_ = auVar97._24_4_ * 0.0;
        auVar43._28_4_ = auVar94._28_4_;
        auVar83 = vfmsub231ps_fma(auVar43,auVar103,auVar91);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar100,ZEXT1632(auVar82));
        auVar157._0_4_ = auVar91._0_4_ * auVar108._0_4_;
        auVar157._4_4_ = auVar91._4_4_ * auVar108._4_4_;
        auVar157._8_4_ = auVar91._8_4_ * auVar108._8_4_;
        auVar157._12_4_ = auVar91._12_4_ * auVar108._12_4_;
        auVar157._16_4_ = auVar91._16_4_ * fVar134;
        auVar157._20_4_ = auVar91._20_4_ * fVar152;
        auVar157._24_4_ = auVar91._24_4_ * fVar135;
        auVar157._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar157,auVar102,auVar92);
        auVar90 = vfmadd231ps_avx512vl(auVar94,auVar100,ZEXT1632(auVar82));
        auVar94 = vmulps_avx512vl(auVar96,auVar109);
        auVar94 = vfmsub231ps_avx512vl(auVar94,auVar93,auVar111);
        auVar44._4_4_ = auVar95._4_4_ * auVar111._4_4_;
        auVar44._0_4_ = auVar95._0_4_ * auVar111._0_4_;
        auVar44._8_4_ = auVar95._8_4_ * auVar111._8_4_;
        auVar44._12_4_ = auVar95._12_4_ * auVar111._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * auVar111._16_4_;
        auVar44._20_4_ = auVar95._20_4_ * auVar111._20_4_;
        auVar44._24_4_ = auVar95._24_4_ * auVar111._24_4_;
        auVar44._28_4_ = auVar111._28_4_;
        auVar82 = vfmsub231ps_fma(auVar44,auVar110,auVar96);
        auVar158._0_4_ = auVar110._0_4_ * auVar93._0_4_;
        auVar158._4_4_ = auVar110._4_4_ * auVar93._4_4_;
        auVar158._8_4_ = auVar110._8_4_ * auVar93._8_4_;
        auVar158._12_4_ = auVar110._12_4_ * auVar93._12_4_;
        auVar158._16_4_ = fVar142 * auVar93._16_4_;
        auVar158._20_4_ = fVar168 * auVar93._20_4_;
        auVar158._24_4_ = fVar170 * auVar93._24_4_;
        auVar158._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar158,auVar95,auVar109);
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar100,auVar94);
        auVar99 = vfmadd231ps_avx512vl(auVar94,auVar100,ZEXT1632(auVar82));
        auVar94 = vmaxps_avx(auVar90,auVar99);
        uVar143 = vcmpps_avx512vl(auVar94,auVar100,2);
        bVar79 = bVar79 & (byte)uVar143;
        auVar193 = ZEXT3264(local_540);
        auVar194 = ZEXT3264(local_500);
        auVar191 = ZEXT3264(local_6c0);
        if (bVar79 == 0) {
          uVar75 = 0;
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar198 = ZEXT3264(auVar94);
          auVar197 = ZEXT3264(local_660);
          auVar200 = ZEXT3264(local_620);
          auVar199 = ZEXT3264(local_640);
        }
        else {
          uVar136 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar183._4_4_ = uVar136;
          auVar183._0_4_ = uVar136;
          auVar183._8_4_ = uVar136;
          auVar183._12_4_ = uVar136;
          auVar183._16_4_ = uVar136;
          auVar183._20_4_ = uVar136;
          auVar183._24_4_ = uVar136;
          auVar183._28_4_ = uVar136;
          auVar185 = ZEXT3264(auVar183);
          auVar45._4_4_ = auVar96._4_4_ * auVar91._4_4_;
          auVar45._0_4_ = auVar96._0_4_ * auVar91._0_4_;
          auVar45._8_4_ = auVar96._8_4_ * auVar91._8_4_;
          auVar45._12_4_ = auVar96._12_4_ * auVar91._12_4_;
          auVar45._16_4_ = auVar96._16_4_ * auVar91._16_4_;
          auVar45._20_4_ = auVar96._20_4_ * auVar91._20_4_;
          auVar45._24_4_ = auVar96._24_4_ * auVar91._24_4_;
          auVar45._28_4_ = auVar94._28_4_;
          auVar84 = vfmsub231ps_fma(auVar45,auVar95,auVar92);
          auVar46._4_4_ = auVar92._4_4_ * auVar93._4_4_;
          auVar46._0_4_ = auVar92._0_4_ * auVar93._0_4_;
          auVar46._8_4_ = auVar92._8_4_ * auVar93._8_4_;
          auVar46._12_4_ = auVar92._12_4_ * auVar93._12_4_;
          auVar46._16_4_ = auVar92._16_4_ * auVar93._16_4_;
          auVar46._20_4_ = auVar92._20_4_ * auVar93._20_4_;
          auVar46._24_4_ = auVar92._24_4_ * auVar93._24_4_;
          auVar46._28_4_ = auVar92._28_4_;
          auVar83 = vfmsub231ps_fma(auVar46,auVar97,auVar96);
          auVar47._4_4_ = auVar95._4_4_ * auVar97._4_4_;
          auVar47._0_4_ = auVar95._0_4_ * auVar97._0_4_;
          auVar47._8_4_ = auVar95._8_4_ * auVar97._8_4_;
          auVar47._12_4_ = auVar95._12_4_ * auVar97._12_4_;
          auVar47._16_4_ = auVar95._16_4_ * auVar97._16_4_;
          auVar47._20_4_ = auVar95._20_4_ * auVar97._20_4_;
          auVar47._24_4_ = auVar95._24_4_ * auVar97._24_4_;
          auVar47._28_4_ = auVar95._28_4_;
          auVar6 = vfmsub231ps_fma(auVar47,auVar93,auVar91);
          auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar83),ZEXT1632(auVar6));
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar84),auVar100);
          auVar91 = vrcp14ps_avx512vl(auVar94);
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar198 = ZEXT3264(auVar92);
          auVar93 = vfnmadd213ps_avx512vl(auVar91,auVar94,auVar92);
          auVar82 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
          auVar48._4_4_ = auVar6._4_4_ * auVar108._4_4_;
          auVar48._0_4_ = auVar6._0_4_ * auVar108._0_4_;
          auVar48._8_4_ = auVar6._8_4_ * auVar108._8_4_;
          auVar48._12_4_ = auVar6._12_4_ * auVar108._12_4_;
          auVar48._16_4_ = fVar134 * 0.0;
          auVar48._20_4_ = fVar152 * 0.0;
          auVar48._24_4_ = fVar135 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar83 = vfmadd231ps_fma(auVar48,auVar102,ZEXT1632(auVar83));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar103,ZEXT1632(auVar84));
          fVar152 = auVar82._0_4_;
          fVar134 = auVar82._4_4_;
          fVar135 = auVar82._8_4_;
          fVar142 = auVar82._12_4_;
          local_3a0 = ZEXT1632(CONCAT412(auVar83._12_4_ * fVar142,
                                         CONCAT48(auVar83._8_4_ * fVar135,
                                                  CONCAT44(auVar83._4_4_ * fVar134,
                                                           auVar83._0_4_ * fVar152))));
          auVar172._4_4_ = uVar77;
          auVar172._0_4_ = uVar77;
          auVar172._8_4_ = uVar77;
          auVar172._12_4_ = uVar77;
          auVar172._16_4_ = uVar77;
          auVar172._20_4_ = uVar77;
          auVar172._24_4_ = uVar77;
          auVar172._28_4_ = uVar77;
          uVar143 = vcmpps_avx512vl(local_3a0,auVar183,2);
          uVar26 = vcmpps_avx512vl(auVar172,local_3a0,2);
          bVar79 = (byte)uVar143 & (byte)uVar26 & bVar79;
          auVar200 = ZEXT3264(local_620);
          auVar199 = ZEXT3264(local_640);
          auVar190 = ZEXT3264(auVar98);
          if (bVar79 == 0) {
            uVar75 = 0;
            auVar197 = ZEXT3264(local_660);
          }
          else {
            uVar143 = vcmpps_avx512vl(auVar94,auVar100,4);
            bVar79 = bVar79 & (byte)uVar143;
            auVar197 = ZEXT3264(local_660);
            if (bVar79 != 0) {
              fVar168 = auVar90._0_4_ * fVar152;
              fVar170 = auVar90._4_4_ * fVar134;
              auVar49._4_4_ = fVar170;
              auVar49._0_4_ = fVar168;
              fVar80 = auVar90._8_4_ * fVar135;
              auVar49._8_4_ = fVar80;
              fVar81 = auVar90._12_4_ * fVar142;
              auVar49._12_4_ = fVar81;
              fVar126 = auVar90._16_4_ * 0.0;
              auVar49._16_4_ = fVar126;
              fVar151 = auVar90._20_4_ * 0.0;
              auVar49._20_4_ = fVar151;
              fVar127 = auVar90._24_4_ * 0.0;
              auVar49._24_4_ = fVar127;
              auVar49._28_4_ = auVar94._28_4_;
              auVar91 = vsubps_avx512vl(auVar92,auVar49);
              local_3e0._0_4_ =
                   (float)((uint)(bVar70 & 1) * (int)fVar168 |
                          (uint)!(bool)(bVar70 & 1) * auVar91._0_4_);
              bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
              local_3e0._4_4_ = (float)((uint)bVar18 * (int)fVar170 | (uint)!bVar18 * auVar91._4_4_)
              ;
              bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar18 * (int)fVar80 | (uint)!bVar18 * auVar91._8_4_);
              bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar18 * (int)fVar81 | (uint)!bVar18 * auVar91._12_4_);
              bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar18 * (int)fVar126 | (uint)!bVar18 * auVar91._16_4_);
              bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar18 * (int)fVar151 | (uint)!bVar18 * auVar91._20_4_);
              bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar18 * (int)fVar127 | (uint)!bVar18 * auVar91._24_4_);
              bVar18 = SUB81(uVar71 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar18 * auVar94._28_4_ | (uint)!bVar18 * auVar91._28_4_);
              auVar94 = vsubps_avx(ZEXT1632(auVar11),auVar88);
              auVar82 = vfmadd213ps_fma(auVar94,local_3e0,auVar88);
              uVar136 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar28._4_4_ = uVar136;
              auVar28._0_4_ = uVar136;
              auVar28._8_4_ = uVar136;
              auVar28._12_4_ = uVar136;
              auVar28._16_4_ = uVar136;
              auVar28._20_4_ = uVar136;
              auVar28._24_4_ = uVar136;
              auVar28._28_4_ = uVar136;
              auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                           CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                    CONCAT44(auVar82._4_4_ +
                                                                             auVar82._4_4_,
                                                                             auVar82._0_4_ +
                                                                             auVar82._0_4_)))),
                                        auVar28);
              uVar143 = vcmpps_avx512vl(local_3a0,auVar94,6);
              if (((byte)uVar143 & bVar79) != 0) {
                auVar155._0_4_ = auVar99._0_4_ * fVar152;
                auVar155._4_4_ = auVar99._4_4_ * fVar134;
                auVar155._8_4_ = auVar99._8_4_ * fVar135;
                auVar155._12_4_ = auVar99._12_4_ * fVar142;
                auVar155._16_4_ = auVar99._16_4_ * 0.0;
                auVar155._20_4_ = auVar99._20_4_ * 0.0;
                auVar155._24_4_ = auVar99._24_4_ * 0.0;
                auVar155._28_4_ = 0;
                auVar94 = vsubps_avx512vl(auVar92,auVar155);
                auVar114._0_4_ =
                     (uint)(bVar70 & 1) * (int)auVar155._0_4_ |
                     (uint)!(bool)(bVar70 & 1) * auVar94._0_4_;
                bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
                auVar114._4_4_ = (uint)bVar18 * (int)auVar155._4_4_ | (uint)!bVar18 * auVar94._4_4_;
                bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
                auVar114._8_4_ = (uint)bVar18 * (int)auVar155._8_4_ | (uint)!bVar18 * auVar94._8_4_;
                bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
                auVar114._12_4_ =
                     (uint)bVar18 * (int)auVar155._12_4_ | (uint)!bVar18 * auVar94._12_4_;
                bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
                auVar114._16_4_ =
                     (uint)bVar18 * (int)auVar155._16_4_ | (uint)!bVar18 * auVar94._16_4_;
                bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
                auVar114._20_4_ =
                     (uint)bVar18 * (int)auVar155._20_4_ | (uint)!bVar18 * auVar94._20_4_;
                bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
                auVar114._24_4_ =
                     (uint)bVar18 * (int)auVar155._24_4_ | (uint)!bVar18 * auVar94._24_4_;
                auVar114._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar94._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar114,auVar92,auVar29);
                local_380 = 0;
                local_370 = local_670._0_8_;
                uStack_368 = local_670._8_8_;
                local_360 = local_680._0_8_;
                uStack_358 = local_680._8_8_;
                local_350 = local_690._0_8_;
                uStack_348 = local_690._8_8_;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar75 = CONCAT71((int7)(uVar75 >> 8),1),
                     pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar152 = 1.0 / auVar175._0_4_;
                    local_320[0] = fVar152 * (local_3e0._0_4_ + 0.0);
                    local_320[1] = fVar152 * (local_3e0._4_4_ + 1.0);
                    local_320[2] = fVar152 * (local_3e0._8_4_ + 2.0);
                    local_320[3] = fVar152 * (local_3e0._12_4_ + 3.0);
                    fStack_310 = fVar152 * (local_3e0._16_4_ + 4.0);
                    fStack_30c = fVar152 * (local_3e0._20_4_ + 5.0);
                    fStack_308 = fVar152 * (local_3e0._24_4_ + 6.0);
                    fStack_304 = local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    local_4a0 = 0;
                    uVar76 = (ulong)((byte)uVar143 & bVar79);
                    for (uVar71 = uVar76; (uVar71 & 1) == 0;
                        uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                      local_4a0 = local_4a0 + 1;
                    }
                    local_420 = vpbroadcastd_avx512vl();
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_5a0 = auVar98;
                    local_520 = auVar183;
                    local_37c = iVar14;
                    do {
                      auVar84 = auVar196._0_16_;
                      local_220 = local_320[local_4a0];
                      local_200 = *(undefined4 *)(local_300 + local_4a0 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_2e0 + local_4a0 * 4);
                      local_6f0.context = context->user;
                      fVar134 = 1.0 - local_220;
                      fVar152 = fVar134 * fVar134 * -3.0;
                      auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134)),
                                                ZEXT416((uint)(local_220 * fVar134)),
                                                ZEXT416(0xc0000000));
                      auVar83 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar134)),
                                                ZEXT416((uint)(local_220 * local_220)),
                                                ZEXT416(0x40000000));
                      fVar134 = auVar82._0_4_ * 3.0;
                      fVar135 = auVar83._0_4_ * 3.0;
                      fVar142 = local_220 * local_220 * 3.0;
                      auVar163._0_4_ = fVar142 * (float)local_4d0._0_4_;
                      auVar163._4_4_ = fVar142 * (float)local_4d0._4_4_;
                      auVar163._8_4_ = fVar142 * fStack_4c8;
                      auVar163._12_4_ = fVar142 * fStack_4c4;
                      auVar137._4_4_ = fVar135;
                      auVar137._0_4_ = fVar135;
                      auVar137._8_4_ = fVar135;
                      auVar137._12_4_ = fVar135;
                      auVar82 = vfmadd132ps_fma(auVar137,auVar163,local_690);
                      auVar153._4_4_ = fVar134;
                      auVar153._0_4_ = fVar134;
                      auVar153._8_4_ = fVar134;
                      auVar153._12_4_ = fVar134;
                      auVar82 = vfmadd132ps_fma(auVar153,auVar82,local_680);
                      auVar138._4_4_ = fVar152;
                      auVar138._0_4_ = fVar152;
                      auVar138._8_4_ = fVar152;
                      auVar138._12_4_ = fVar152;
                      auVar82 = vfmadd132ps_fma(auVar138,auVar82,local_670);
                      local_280 = auVar82._0_4_;
                      auVar159._8_4_ = 1;
                      auVar159._0_8_ = 0x100000001;
                      auVar159._12_4_ = 1;
                      auVar159._16_4_ = 1;
                      auVar159._20_4_ = 1;
                      auVar159._24_4_ = 1;
                      auVar159._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar159,ZEXT1632(auVar82));
                      auVar166._8_4_ = 2;
                      auVar166._0_8_ = 0x200000002;
                      auVar166._12_4_ = 2;
                      auVar166._16_4_ = 2;
                      auVar166._20_4_ = 2;
                      auVar166._24_4_ = 2;
                      auVar166._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar166,ZEXT1632(auVar82));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_4c0._0_8_;
                      uStack_1d8 = local_4c0._8_8_;
                      uStack_1d0 = local_4c0._16_8_;
                      uStack_1c8 = local_4c0._24_8_;
                      local_1c0 = local_420;
                      vpcmpeqd_avx2(local_420,local_420);
                      local_1a0 = (local_6f0.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_6f0.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_600 = local_2a0;
                      local_6f0.valid = (int *)local_600;
                      local_6f0.geometryUserPtr = pGVar15->userPtr;
                      local_6f0.hit = (RTCHitN *)&local_280;
                      local_6f0.N = 8;
                      local_480 = (uint)uVar76;
                      uStack_47c = (uint)(uVar76 >> 0x20);
                      local_6f0.ray = (RTCRayN *)ray;
                      if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar15->occlusionFilterN)(&local_6f0);
                        uVar76 = CONCAT44(uStack_47c,local_480);
                        auVar185 = ZEXT3264(local_520);
                        auVar190 = ZEXT3264(local_5a0);
                        auVar199 = ZEXT3264(local_640);
                        auVar200 = ZEXT3264(local_620);
                        auVar197 = ZEXT3264(local_660);
                        auVar191 = ZEXT3264(local_6c0);
                        auVar192 = ZEXT3264(local_580);
                        auVar195 = ZEXT3264(local_560);
                        auVar194 = ZEXT3264(local_500);
                        auVar193 = ZEXT3264(local_540);
                        auVar82 = vxorps_avx512vl(auVar84,auVar84);
                        auVar196 = ZEXT1664(auVar82);
                        uVar77 = local_5c0._0_4_;
                      }
                      auVar82 = auVar196._0_16_;
                      if (local_600 == (undefined1  [32])0x0) {
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar198 = ZEXT3264(auVar94);
                      }
                      else {
                        p_Var17 = context->args->filter;
                        if (p_Var17 == (RTCFilterFunctionN)0x0) {
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar94);
                        }
                        else {
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar94);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var17)(&local_6f0);
                            uVar76 = CONCAT44(uStack_47c,local_480);
                            auVar185 = ZEXT3264(local_520);
                            auVar190 = ZEXT3264(local_5a0);
                            auVar199 = ZEXT3264(local_640);
                            auVar200 = ZEXT3264(local_620);
                            auVar197 = ZEXT3264(local_660);
                            auVar191 = ZEXT3264(local_6c0);
                            auVar192 = ZEXT3264(local_580);
                            auVar195 = ZEXT3264(local_560);
                            auVar194 = ZEXT3264(local_500);
                            auVar193 = ZEXT3264(local_540);
                            auVar82 = vxorps_avx512vl(auVar82,auVar82);
                            auVar196 = ZEXT1664(auVar82);
                            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar198 = ZEXT3264(auVar94);
                            uVar77 = local_5c0._0_4_;
                          }
                        }
                        auVar98 = auVar190._0_32_;
                        uVar71 = vptestmd_avx512vl(local_600,local_600);
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar18 = (bool)((byte)uVar71 & 1);
                        bVar19 = (bool)((byte)(uVar71 >> 1) & 1);
                        bVar20 = (bool)((byte)(uVar71 >> 2) & 1);
                        bVar21 = (bool)((byte)(uVar71 >> 3) & 1);
                        bVar22 = (bool)((byte)(uVar71 >> 4) & 1);
                        bVar23 = (bool)((byte)(uVar71 >> 5) & 1);
                        bVar24 = (bool)((byte)(uVar71 >> 6) & 1);
                        bVar25 = SUB81(uVar71 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x100) =
                             (uint)bVar18 * auVar94._0_4_ |
                             (uint)!bVar18 * *(int *)(local_6f0.ray + 0x100);
                        *(uint *)(local_6f0.ray + 0x104) =
                             (uint)bVar19 * auVar94._4_4_ |
                             (uint)!bVar19 * *(int *)(local_6f0.ray + 0x104);
                        *(uint *)(local_6f0.ray + 0x108) =
                             (uint)bVar20 * auVar94._8_4_ |
                             (uint)!bVar20 * *(int *)(local_6f0.ray + 0x108);
                        *(uint *)(local_6f0.ray + 0x10c) =
                             (uint)bVar21 * auVar94._12_4_ |
                             (uint)!bVar21 * *(int *)(local_6f0.ray + 0x10c);
                        *(uint *)(local_6f0.ray + 0x110) =
                             (uint)bVar22 * auVar94._16_4_ |
                             (uint)!bVar22 * *(int *)(local_6f0.ray + 0x110);
                        *(uint *)(local_6f0.ray + 0x114) =
                             (uint)bVar23 * auVar94._20_4_ |
                             (uint)!bVar23 * *(int *)(local_6f0.ray + 0x114);
                        *(uint *)(local_6f0.ray + 0x118) =
                             (uint)bVar24 * auVar94._24_4_ |
                             (uint)!bVar24 * *(int *)(local_6f0.ray + 0x118);
                        *(uint *)(local_6f0.ray + 0x11c) =
                             (uint)bVar25 * auVar94._28_4_ |
                             (uint)!bVar25 * *(int *)(local_6f0.ray + 0x11c);
                        if (local_600 != (undefined1  [32])0x0) {
                          uVar75 = CONCAT71((int7)(uVar75 >> 8),1);
                          break;
                        }
                      }
                      auVar98 = auVar190._0_32_;
                      *(int *)(ray + k * 4 + 0x100) = auVar185._0_4_;
                      uVar71 = local_4a0 & 0x3f;
                      uVar75 = 0;
                      local_4a0 = 0;
                      uVar76 = uVar76 ^ 1L << uVar71;
                      for (uVar71 = uVar76; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        local_4a0 = local_4a0 + 1;
                      }
                    } while (uVar76 != 0);
                  }
                  goto LAB_01ddb6ef;
                }
              }
            }
            uVar75 = 0;
          }
        }
      }
LAB_01ddb6ef:
      if (8 < iVar14) {
        local_5c0 = vpbroadcastd_avx512vl();
        uStack_3fc = local_400;
        uStack_3f8 = local_400;
        uStack_3f4 = local_400;
        uStack_3f0 = local_400;
        uStack_3ec = local_400;
        uStack_3e8 = local_400;
        uStack_3e4 = local_400;
        fStack_498 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar78 = 8;
        local_5a0 = auVar98;
        fStack_494 = fStack_498;
        fStack_490 = fStack_498;
        fStack_48c = fStack_498;
        fStack_488 = fStack_498;
        fStack_484 = fStack_498;
        local_480 = uVar77;
        uStack_47c = uVar77;
        uStack_478 = uVar77;
        uStack_474 = uVar77;
        uStack_470 = uVar77;
        uStack_46c = uVar77;
        uStack_468 = uVar77;
        uStack_464 = uVar77;
        local_4a0._0_4_ = fStack_498;
        local_4a0._4_4_ = fStack_498;
        do {
          auVar94 = vpbroadcastd_avx512vl();
          auVar95 = vpor_avx2(auVar94,_DAT_01fe9900);
          uVar26 = vpcmpd_avx512vl(auVar95,local_5c0,1);
          auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 * 4 + lVar27);
          auVar91 = *(undefined1 (*) [32])(lVar27 + 0x21aa768 + lVar78 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar27 + 0x21aabec + lVar78 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar27 + 0x21ab070 + lVar78 * 4);
          local_620 = auVar200._0_32_;
          auVar96 = vmulps_avx512vl(local_620,auVar93);
          local_640 = auVar199._0_32_;
          auVar103 = vmulps_avx512vl(local_640,auVar93);
          auVar50._4_4_ = auVar93._4_4_ * (float)local_100._4_4_;
          auVar50._0_4_ = auVar93._0_4_ * (float)local_100._0_4_;
          auVar50._8_4_ = auVar93._8_4_ * fStack_f8;
          auVar50._12_4_ = auVar93._12_4_ * fStack_f4;
          auVar50._16_4_ = auVar93._16_4_ * fStack_f0;
          auVar50._20_4_ = auVar93._20_4_ * fStack_ec;
          auVar50._24_4_ = auVar93._24_4_ * fStack_e8;
          auVar50._28_4_ = auVar95._28_4_;
          auVar145 = auVar191._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar145);
          local_660 = auVar197._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar103,auVar92,local_660);
          auVar103 = vfmadd231ps_avx512vl(auVar50,auVar92,local_e0);
          auVar169 = auVar195._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar169);
          auVar149 = auVar192._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar149);
          auVar82 = vfmadd231ps_fma(auVar103,auVar91,local_c0);
          auVar165 = auVar193._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar165);
          local_500 = auVar194._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar96,auVar94,local_500);
          auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 * 4 + lVar27);
          auVar96 = *(undefined1 (*) [32])(lVar27 + 0x21acb88 + lVar78 * 4);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar94,local_a0);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x21ad00c + lVar78 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21ad490 + lVar78 * 4);
          auVar98 = vmulps_avx512vl(local_620,auVar102);
          auVar97 = vmulps_avx512vl(local_640,auVar102);
          auVar51._4_4_ = auVar102._4_4_ * (float)local_100._4_4_;
          auVar51._0_4_ = auVar102._0_4_ * (float)local_100._0_4_;
          auVar51._8_4_ = auVar102._8_4_ * fStack_f8;
          auVar51._12_4_ = auVar102._12_4_ * fStack_f4;
          auVar51._16_4_ = auVar102._16_4_ * fStack_f0;
          auVar51._20_4_ = auVar102._20_4_ * fStack_ec;
          auVar51._24_4_ = auVar102._24_4_ * fStack_e8;
          auVar51._28_4_ = uStack_e4;
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar145);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,local_660);
          auVar100 = vfmadd231ps_avx512vl(auVar51,auVar103,local_e0);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar169);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar149);
          auVar83 = vfmadd231ps_fma(auVar100,auVar96,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar165);
          auVar88 = vfmadd231ps_avx512vl(auVar97,auVar95,local_500);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar95,local_a0);
          auVar89 = vmaxps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar83));
          auVar98 = vsubps_avx(auVar100,auVar90);
          auVar97 = vsubps_avx(auVar88,auVar99);
          auVar101 = vmulps_avx512vl(auVar99,auVar98);
          auVar115 = vmulps_avx512vl(auVar90,auVar97);
          auVar101 = vsubps_avx512vl(auVar101,auVar115);
          auVar115 = vmulps_avx512vl(auVar97,auVar97);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar98,auVar98);
          auVar89 = vmulps_avx512vl(auVar89,auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar115);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          uVar143 = vcmpps_avx512vl(auVar101,auVar89,2);
          bVar79 = (byte)uVar26 & (byte)uVar143;
          if (bVar79 == 0) {
            auVar191 = ZEXT3264(auVar145);
          }
          else {
            auVar102 = vmulps_avx512vl(local_5a0,auVar102);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar103);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar96);
            auVar93 = vmulps_avx512vl(local_5a0,auVar93);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar93);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
            auVar96 = vfmadd213ps_avx512vl(auVar94,local_120,auVar91);
            auVar94 = *(undefined1 (*) [32])(lVar27 + 0x21ab4f4 + lVar78 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar27 + 0x21ab978 + lVar78 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar27 + 0x21abdfc + lVar78 * 4);
            auVar93 = *(undefined1 (*) [32])(lVar27 + 0x21ac280 + lVar78 * 4);
            auVar103 = vmulps_avx512vl(local_620,auVar93);
            auVar102 = vmulps_avx512vl(local_640,auVar93);
            auVar93 = vmulps_avx512vl(local_5a0,auVar93);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar145);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,local_660);
            auVar92 = vfmadd231ps_avx512vl(auVar93,local_160,auVar92);
            auVar93 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar169);
            auVar103 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar149);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,auVar165);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_500);
            auVar102 = vfmadd231ps_avx512vl(auVar91,local_120,auVar94);
            auVar94 = *(undefined1 (*) [32])(lVar27 + 0x21ad914 + lVar78 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar27 + 0x21ae21c + lVar78 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar27 + 0x21ae6a0 + lVar78 * 4);
            auVar89 = vmulps_avx512vl(local_620,auVar92);
            auVar101 = vmulps_avx512vl(local_640,auVar92);
            auVar92 = vmulps_avx512vl(local_5a0,auVar92);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar145);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,local_660);
            auVar92 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
            auVar91 = *(undefined1 (*) [32])(lVar27 + 0x21add98 + lVar78 * 4);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar169);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,auVar149);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
            auVar92 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar165);
            auVar89 = vfmadd231ps_avx512vl(auVar101,auVar94,local_500);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_120,auVar94);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar93,auVar101);
            vandps_avx512vl(auVar103,auVar101);
            auVar94 = vmaxps_avx(auVar101,auVar101);
            vandps_avx512vl(auVar102,auVar101);
            auVar94 = vmaxps_avx(auVar94,auVar101);
            auVar69._4_4_ = uStack_3fc;
            auVar69._0_4_ = local_400;
            auVar69._8_4_ = uStack_3f8;
            auVar69._12_4_ = uStack_3f4;
            auVar69._16_4_ = uStack_3f0;
            auVar69._20_4_ = uStack_3ec;
            auVar69._24_4_ = uStack_3e8;
            auVar69._28_4_ = uStack_3e4;
            uVar71 = vcmpps_avx512vl(auVar94,auVar69,1);
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar116._0_4_ = (float)((uint)bVar18 * auVar98._0_4_ | (uint)!bVar18 * auVar93._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar18 * auVar98._4_4_ | (uint)!bVar18 * auVar93._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar18 * auVar98._8_4_ | (uint)!bVar18 * auVar93._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar18 * auVar98._12_4_ | (uint)!bVar18 * auVar93._12_4_);
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar18 * auVar98._16_4_ | (uint)!bVar18 * auVar93._16_4_);
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar18 * auVar98._20_4_ | (uint)!bVar18 * auVar93._20_4_);
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar18 * auVar98._24_4_ | (uint)!bVar18 * auVar93._24_4_);
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar116._28_4_ = (uint)bVar18 * auVar98._28_4_ | (uint)!bVar18 * auVar93._28_4_;
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar117._0_4_ = (float)((uint)bVar18 * auVar97._0_4_ | (uint)!bVar18 * auVar103._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar18 * auVar97._4_4_ | (uint)!bVar18 * auVar103._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar18 * auVar97._8_4_ | (uint)!bVar18 * auVar103._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar18 * auVar97._12_4_ | (uint)!bVar18 * auVar103._12_4_);
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar18 * auVar97._16_4_ | (uint)!bVar18 * auVar103._16_4_);
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar18 * auVar97._20_4_ | (uint)!bVar18 * auVar103._20_4_);
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar18 * auVar97._24_4_ | (uint)!bVar18 * auVar103._24_4_);
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar117._28_4_ = (uint)bVar18 * auVar97._28_4_ | (uint)!bVar18 * auVar103._28_4_;
            vandps_avx512vl(auVar92,auVar101);
            vandps_avx512vl(auVar89,auVar101);
            auVar94 = vmaxps_avx(auVar117,auVar117);
            vandps_avx512vl(auVar91,auVar101);
            auVar94 = vmaxps_avx(auVar94,auVar117);
            uVar71 = vcmpps_avx512vl(auVar94,auVar69,1);
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar118._0_4_ = (uint)bVar18 * auVar98._0_4_ | (uint)!bVar18 * auVar92._0_4_;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar18 * auVar98._4_4_ | (uint)!bVar18 * auVar92._4_4_;
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar18 * auVar98._8_4_ | (uint)!bVar18 * auVar92._8_4_;
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar18 * auVar98._12_4_ | (uint)!bVar18 * auVar92._12_4_;
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar118._16_4_ = (uint)bVar18 * auVar98._16_4_ | (uint)!bVar18 * auVar92._16_4_;
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar118._20_4_ = (uint)bVar18 * auVar98._20_4_ | (uint)!bVar18 * auVar92._20_4_;
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar118._24_4_ = (uint)bVar18 * auVar98._24_4_ | (uint)!bVar18 * auVar92._24_4_;
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar118._28_4_ = (uint)bVar18 * auVar98._28_4_ | (uint)!bVar18 * auVar92._28_4_;
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar119._0_4_ = (float)((uint)bVar18 * auVar97._0_4_ | (uint)!bVar18 * auVar89._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar18 * auVar97._4_4_ | (uint)!bVar18 * auVar89._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar18 * auVar97._8_4_ | (uint)!bVar18 * auVar89._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar18 * auVar97._12_4_ | (uint)!bVar18 * auVar89._12_4_);
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar18 * auVar97._16_4_ | (uint)!bVar18 * auVar89._16_4_);
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar18 * auVar97._20_4_ | (uint)!bVar18 * auVar89._20_4_);
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar18 * auVar97._24_4_ | (uint)!bVar18 * auVar89._24_4_);
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar119._28_4_ = (uint)bVar18 * auVar97._28_4_ | (uint)!bVar18 * auVar89._28_4_;
            auVar177._8_4_ = 0x80000000;
            auVar177._0_8_ = 0x8000000080000000;
            auVar177._12_4_ = 0x80000000;
            auVar177._16_4_ = 0x80000000;
            auVar177._20_4_ = 0x80000000;
            auVar177._24_4_ = 0x80000000;
            auVar177._28_4_ = 0x80000000;
            auVar94 = vxorps_avx512vl(auVar118,auVar177);
            auVar89 = auVar196._0_32_;
            auVar91 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar89);
            auVar84 = vfmadd231ps_fma(auVar91,auVar117,auVar117);
            auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
            auVar189._8_4_ = 0xbf000000;
            auVar189._0_8_ = 0xbf000000bf000000;
            auVar189._12_4_ = 0xbf000000;
            auVar189._16_4_ = 0xbf000000;
            auVar189._20_4_ = 0xbf000000;
            auVar189._24_4_ = 0xbf000000;
            auVar189._28_4_ = 0xbf000000;
            fVar152 = auVar91._0_4_;
            fVar134 = auVar91._4_4_;
            fVar135 = auVar91._8_4_;
            fVar142 = auVar91._12_4_;
            fVar168 = auVar91._16_4_;
            fVar170 = auVar91._20_4_;
            fVar80 = auVar91._24_4_;
            auVar52._4_4_ = fVar134 * fVar134 * fVar134 * auVar84._4_4_ * -0.5;
            auVar52._0_4_ = fVar152 * fVar152 * fVar152 * auVar84._0_4_ * -0.5;
            auVar52._8_4_ = fVar135 * fVar135 * fVar135 * auVar84._8_4_ * -0.5;
            auVar52._12_4_ = fVar142 * fVar142 * fVar142 * auVar84._12_4_ * -0.5;
            auVar52._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
            auVar52._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar52._24_4_ = fVar80 * fVar80 * fVar80 * -0.0;
            auVar52._28_4_ = auVar117._28_4_;
            auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar91 = vfmadd231ps_avx512vl(auVar52,auVar92,auVar91);
            auVar53._4_4_ = auVar117._4_4_ * auVar91._4_4_;
            auVar53._0_4_ = auVar117._0_4_ * auVar91._0_4_;
            auVar53._8_4_ = auVar117._8_4_ * auVar91._8_4_;
            auVar53._12_4_ = auVar117._12_4_ * auVar91._12_4_;
            auVar53._16_4_ = auVar117._16_4_ * auVar91._16_4_;
            auVar53._20_4_ = auVar117._20_4_ * auVar91._20_4_;
            auVar53._24_4_ = auVar117._24_4_ * auVar91._24_4_;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = auVar91._4_4_ * -auVar116._4_4_;
            auVar54._0_4_ = auVar91._0_4_ * -auVar116._0_4_;
            auVar54._8_4_ = auVar91._8_4_ * -auVar116._8_4_;
            auVar54._12_4_ = auVar91._12_4_ * -auVar116._12_4_;
            auVar54._16_4_ = auVar91._16_4_ * -auVar116._16_4_;
            auVar54._20_4_ = auVar91._20_4_ * -auVar116._20_4_;
            auVar54._24_4_ = auVar91._24_4_ * -auVar116._24_4_;
            auVar54._28_4_ = auVar117._28_4_;
            auVar93 = vmulps_avx512vl(auVar91,auVar89);
            auVar91 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar89);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar119,auVar119);
            auVar103 = vrsqrt14ps_avx512vl(auVar91);
            auVar91 = vmulps_avx512vl(auVar91,auVar189);
            fVar152 = auVar103._0_4_;
            fVar134 = auVar103._4_4_;
            fVar135 = auVar103._8_4_;
            fVar142 = auVar103._12_4_;
            fVar168 = auVar103._16_4_;
            fVar170 = auVar103._20_4_;
            fVar80 = auVar103._24_4_;
            auVar55._4_4_ = fVar134 * fVar134 * fVar134 * auVar91._4_4_;
            auVar55._0_4_ = fVar152 * fVar152 * fVar152 * auVar91._0_4_;
            auVar55._8_4_ = fVar135 * fVar135 * fVar135 * auVar91._8_4_;
            auVar55._12_4_ = fVar142 * fVar142 * fVar142 * auVar91._12_4_;
            auVar55._16_4_ = fVar168 * fVar168 * fVar168 * auVar91._16_4_;
            auVar55._20_4_ = fVar170 * fVar170 * fVar170 * auVar91._20_4_;
            auVar55._24_4_ = fVar80 * fVar80 * fVar80 * auVar91._24_4_;
            auVar55._28_4_ = auVar91._28_4_;
            auVar91 = vfmadd231ps_avx512vl(auVar55,auVar92,auVar103);
            auVar56._4_4_ = auVar119._4_4_ * auVar91._4_4_;
            auVar56._0_4_ = auVar119._0_4_ * auVar91._0_4_;
            auVar56._8_4_ = auVar119._8_4_ * auVar91._8_4_;
            auVar56._12_4_ = auVar119._12_4_ * auVar91._12_4_;
            auVar56._16_4_ = auVar119._16_4_ * auVar91._16_4_;
            auVar56._20_4_ = auVar119._20_4_ * auVar91._20_4_;
            auVar56._24_4_ = auVar119._24_4_ * auVar91._24_4_;
            auVar56._28_4_ = auVar103._28_4_;
            auVar57._4_4_ = auVar91._4_4_ * auVar94._4_4_;
            auVar57._0_4_ = auVar91._0_4_ * auVar94._0_4_;
            auVar57._8_4_ = auVar91._8_4_ * auVar94._8_4_;
            auVar57._12_4_ = auVar91._12_4_ * auVar94._12_4_;
            auVar57._16_4_ = auVar91._16_4_ * auVar94._16_4_;
            auVar57._20_4_ = auVar91._20_4_ * auVar94._20_4_;
            auVar57._24_4_ = auVar91._24_4_ * auVar94._24_4_;
            auVar57._28_4_ = auVar94._28_4_;
            auVar94 = vmulps_avx512vl(auVar91,auVar89);
            auVar84 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar82),auVar90);
            auVar91 = ZEXT1632(auVar82);
            auVar6 = vfmadd213ps_fma(auVar54,auVar91,auVar99);
            auVar92 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar96);
            auVar103 = vfmadd213ps_avx512vl(auVar56,ZEXT1632(auVar83),auVar100);
            auVar11 = vfnmadd213ps_fma(auVar53,auVar91,auVar90);
            auVar102 = ZEXT1632(auVar83);
            auVar7 = vfmadd213ps_fma(auVar57,auVar102,auVar88);
            auVar85 = vfnmadd213ps_fma(auVar54,auVar91,auVar99);
            auVar8 = vfmadd213ps_fma(auVar94,auVar102,auVar95);
            auVar99 = ZEXT1632(auVar82);
            auVar87 = vfnmadd231ps_fma(auVar96,auVar99,auVar93);
            auVar86 = vfnmadd213ps_fma(auVar56,auVar102,auVar100);
            auVar144 = vfnmadd213ps_fma(auVar57,auVar102,auVar88);
            auVar147 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar83),auVar94);
            auVar95 = vsubps_avx512vl(auVar103,ZEXT1632(auVar11));
            auVar94 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar85));
            auVar91 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar87));
            auVar58._4_4_ = auVar94._4_4_ * auVar87._4_4_;
            auVar58._0_4_ = auVar94._0_4_ * auVar87._0_4_;
            auVar58._8_4_ = auVar94._8_4_ * auVar87._8_4_;
            auVar58._12_4_ = auVar94._12_4_ * auVar87._12_4_;
            auVar58._16_4_ = auVar94._16_4_ * 0.0;
            auVar58._20_4_ = auVar94._20_4_ * 0.0;
            auVar58._24_4_ = auVar94._24_4_ * 0.0;
            auVar58._28_4_ = auVar93._28_4_;
            auVar82 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar85),auVar91);
            auVar59._4_4_ = auVar91._4_4_ * auVar11._4_4_;
            auVar59._0_4_ = auVar91._0_4_ * auVar11._0_4_;
            auVar59._8_4_ = auVar91._8_4_ * auVar11._8_4_;
            auVar59._12_4_ = auVar91._12_4_ * auVar11._12_4_;
            auVar59._16_4_ = auVar91._16_4_ * 0.0;
            auVar59._20_4_ = auVar91._20_4_ * 0.0;
            auVar59._24_4_ = auVar91._24_4_ * 0.0;
            auVar59._28_4_ = auVar91._28_4_;
            auVar9 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar87),auVar95);
            auVar60._4_4_ = auVar85._4_4_ * auVar95._4_4_;
            auVar60._0_4_ = auVar85._0_4_ * auVar95._0_4_;
            auVar60._8_4_ = auVar85._8_4_ * auVar95._8_4_;
            auVar60._12_4_ = auVar85._12_4_ * auVar95._12_4_;
            auVar60._16_4_ = auVar95._16_4_ * 0.0;
            auVar60._20_4_ = auVar95._20_4_ * 0.0;
            auVar60._24_4_ = auVar95._24_4_ * 0.0;
            auVar60._28_4_ = auVar95._28_4_;
            auVar10 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar11),auVar94);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar89,ZEXT1632(auVar9));
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar82));
            uVar71 = vcmpps_avx512vl(auVar94,auVar89,2);
            bVar70 = (byte)uVar71;
            fVar151 = (float)((uint)(bVar70 & 1) * auVar84._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar86._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar128 = (float)((uint)bVar18 * auVar84._4_4_ | (uint)!bVar18 * auVar86._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar131 = (float)((uint)bVar18 * auVar84._8_4_ | (uint)!bVar18 * auVar86._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar132 = (float)((uint)bVar18 * auVar84._12_4_ | (uint)!bVar18 * auVar86._12_4_);
            auVar102 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar131,CONCAT44(fVar128,fVar151))));
            fVar127 = (float)((uint)(bVar70 & 1) * auVar6._0_4_ |
                             (uint)!(bool)(bVar70 & 1) * auVar144._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar130 = (float)((uint)bVar18 * auVar6._4_4_ | (uint)!bVar18 * auVar144._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar129 = (float)((uint)bVar18 * auVar6._8_4_ | (uint)!bVar18 * auVar144._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar133 = (float)((uint)bVar18 * auVar6._12_4_ | (uint)!bVar18 * auVar144._12_4_);
            auVar98 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar129,CONCAT44(fVar130,fVar127))));
            auVar120._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar92._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar147._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar18 * auVar92._4_4_ | (uint)!bVar18 * auVar147._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar18 * auVar92._8_4_ | (uint)!bVar18 * auVar147._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar18 * auVar92._12_4_ | (uint)!bVar18 * auVar147._12_4_);
            fVar152 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar92._16_4_);
            auVar120._16_4_ = fVar152;
            fVar134 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar92._20_4_);
            auVar120._20_4_ = fVar134;
            fVar135 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar92._24_4_);
            auVar120._24_4_ = fVar135;
            iVar1 = (uint)(byte)(uVar71 >> 7) * auVar92._28_4_;
            auVar120._28_4_ = iVar1;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar103);
            auVar121._0_4_ =
                 (uint)(bVar70 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar82._0_4_;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar18 * auVar94._4_4_ | (uint)!bVar18 * auVar82._4_4_;
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar18 * auVar94._8_4_ | (uint)!bVar18 * auVar82._8_4_;
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar18 * auVar94._12_4_ | (uint)!bVar18 * auVar82._12_4_;
            auVar121._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar94._16_4_;
            auVar121._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar94._20_4_;
            auVar121._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar94._24_4_;
            auVar121._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar94._28_4_;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar7));
            auVar122._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar84._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar18 * auVar94._4_4_ | (uint)!bVar18 * auVar84._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar18 * auVar94._8_4_ | (uint)!bVar18 * auVar84._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar18 * auVar94._12_4_ | (uint)!bVar18 * auVar84._12_4_);
            fVar142 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar94._16_4_);
            auVar122._16_4_ = fVar142;
            fVar168 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar94._20_4_);
            auVar122._20_4_ = fVar168;
            fVar170 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar94._24_4_);
            auVar122._24_4_ = fVar170;
            auVar122._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar94._28_4_;
            auVar94 = vblendmps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar8));
            auVar123._0_4_ =
                 (float)((uint)(bVar70 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar70 & 1) * auVar6._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar18 * auVar94._4_4_ | (uint)!bVar18 * auVar6._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar18 * auVar94._8_4_ | (uint)!bVar18 * auVar6._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar123._12_4_ = (float)((uint)bVar18 * auVar94._12_4_ | (uint)!bVar18 * auVar6._12_4_)
            ;
            fVar126 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar94._16_4_);
            auVar123._16_4_ = fVar126;
            fVar81 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar94._20_4_);
            auVar123._20_4_ = fVar81;
            fVar80 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar94._24_4_);
            auVar123._24_4_ = fVar80;
            iVar2 = (uint)(byte)(uVar71 >> 7) * auVar94._28_4_;
            auVar123._28_4_ = iVar2;
            auVar124._0_4_ =
                 (uint)(bVar70 & 1) * (int)auVar11._0_4_ |
                 (uint)!(bool)(bVar70 & 1) * auVar103._0_4_;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar18 * (int)auVar11._4_4_ | (uint)!bVar18 * auVar103._4_4_;
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar18 * (int)auVar11._8_4_ | (uint)!bVar18 * auVar103._8_4_;
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar18 * (int)auVar11._12_4_ | (uint)!bVar18 * auVar103._12_4_;
            auVar124._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar103._16_4_;
            auVar124._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar103._20_4_;
            auVar124._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar103._24_4_;
            auVar124._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar103._28_4_;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar103 = vsubps_avx512vl(auVar124,auVar102);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar85._12_4_ |
                                                    (uint)!bVar22 * auVar7._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar85._8_4_ |
                                                             (uint)!bVar20 * auVar7._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar85._4_4_ |
                                                                      (uint)!bVar18 * auVar7._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar85._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar7._0_4_)))),auVar98);
            auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar87._12_4_ |
                                                    (uint)!bVar23 * auVar8._12_4_,
                                                    CONCAT48((uint)bVar21 * (int)auVar87._8_4_ |
                                                             (uint)!bVar21 * auVar8._8_4_,
                                                             CONCAT44((uint)bVar19 *
                                                                      (int)auVar87._4_4_ |
                                                                      (uint)!bVar19 * auVar8._4_4_,
                                                                      (uint)(bVar70 & 1) *
                                                                      (int)auVar87._0_4_ |
                                                                      (uint)!(bool)(bVar70 & 1) *
                                                                      auVar8._0_4_)))),auVar120);
            auVar93 = vsubps_avx(auVar102,auVar121);
            auVar95 = vsubps_avx(auVar98,auVar122);
            auVar96 = vsubps_avx(auVar120,auVar123);
            auVar61._4_4_ = auVar92._4_4_ * fVar128;
            auVar61._0_4_ = auVar92._0_4_ * fVar151;
            auVar61._8_4_ = auVar92._8_4_ * fVar131;
            auVar61._12_4_ = auVar92._12_4_ * fVar132;
            auVar61._16_4_ = auVar92._16_4_ * 0.0;
            auVar61._20_4_ = auVar92._20_4_ * 0.0;
            auVar61._24_4_ = auVar92._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar61,auVar120,auVar103);
            auVar156._0_4_ = fVar127 * auVar103._0_4_;
            auVar156._4_4_ = fVar130 * auVar103._4_4_;
            auVar156._8_4_ = fVar129 * auVar103._8_4_;
            auVar156._12_4_ = fVar133 * auVar103._12_4_;
            auVar156._16_4_ = auVar103._16_4_ * 0.0;
            auVar156._20_4_ = auVar103._20_4_ * 0.0;
            auVar156._24_4_ = auVar103._24_4_ * 0.0;
            auVar156._28_4_ = 0;
            auVar84 = vfmsub231ps_fma(auVar156,auVar102,auVar91);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar89,ZEXT1632(auVar82));
            auVar160._0_4_ = auVar91._0_4_ * auVar120._0_4_;
            auVar160._4_4_ = auVar91._4_4_ * auVar120._4_4_;
            auVar160._8_4_ = auVar91._8_4_ * auVar120._8_4_;
            auVar160._12_4_ = auVar91._12_4_ * auVar120._12_4_;
            auVar160._16_4_ = auVar91._16_4_ * fVar152;
            auVar160._20_4_ = auVar91._20_4_ * fVar134;
            auVar160._24_4_ = auVar91._24_4_ * fVar135;
            auVar160._28_4_ = 0;
            auVar82 = vfmsub231ps_fma(auVar160,auVar98,auVar92);
            auVar97 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar82));
            auVar94 = vmulps_avx512vl(auVar96,auVar121);
            auVar94 = vfmsub231ps_avx512vl(auVar94,auVar93,auVar123);
            auVar62._4_4_ = auVar95._4_4_ * auVar123._4_4_;
            auVar62._0_4_ = auVar95._0_4_ * auVar123._0_4_;
            auVar62._8_4_ = auVar95._8_4_ * auVar123._8_4_;
            auVar62._12_4_ = auVar95._12_4_ * auVar123._12_4_;
            auVar62._16_4_ = auVar95._16_4_ * fVar126;
            auVar62._20_4_ = auVar95._20_4_ * fVar81;
            auVar62._24_4_ = auVar95._24_4_ * fVar80;
            auVar62._28_4_ = iVar2;
            auVar82 = vfmsub231ps_fma(auVar62,auVar122,auVar96);
            auVar161._0_4_ = auVar122._0_4_ * auVar93._0_4_;
            auVar161._4_4_ = auVar122._4_4_ * auVar93._4_4_;
            auVar161._8_4_ = auVar122._8_4_ * auVar93._8_4_;
            auVar161._12_4_ = auVar122._12_4_ * auVar93._12_4_;
            auVar161._16_4_ = fVar142 * auVar93._16_4_;
            auVar161._20_4_ = fVar168 * auVar93._20_4_;
            auVar161._24_4_ = fVar170 * auVar93._24_4_;
            auVar161._28_4_ = 0;
            auVar84 = vfmsub231ps_fma(auVar161,auVar95,auVar121);
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar89,auVar94);
            auVar90 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar82));
            auVar94 = vmaxps_avx(auVar97,auVar90);
            uVar143 = vcmpps_avx512vl(auVar94,auVar89,2);
            bVar79 = bVar79 & (byte)uVar143;
            if (bVar79 != 0) {
              uVar136 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar184._4_4_ = uVar136;
              auVar184._0_4_ = uVar136;
              auVar184._8_4_ = uVar136;
              auVar184._12_4_ = uVar136;
              auVar184._16_4_ = uVar136;
              auVar184._20_4_ = uVar136;
              auVar184._24_4_ = uVar136;
              auVar184._28_4_ = uVar136;
              auVar185 = ZEXT3264(auVar184);
              auVar63._4_4_ = auVar96._4_4_ * auVar91._4_4_;
              auVar63._0_4_ = auVar96._0_4_ * auVar91._0_4_;
              auVar63._8_4_ = auVar96._8_4_ * auVar91._8_4_;
              auVar63._12_4_ = auVar96._12_4_ * auVar91._12_4_;
              auVar63._16_4_ = auVar96._16_4_ * auVar91._16_4_;
              auVar63._20_4_ = auVar96._20_4_ * auVar91._20_4_;
              auVar63._24_4_ = auVar96._24_4_ * auVar91._24_4_;
              auVar63._28_4_ = auVar94._28_4_;
              auVar6 = vfmsub231ps_fma(auVar63,auVar95,auVar92);
              auVar64._4_4_ = auVar92._4_4_ * auVar93._4_4_;
              auVar64._0_4_ = auVar92._0_4_ * auVar93._0_4_;
              auVar64._8_4_ = auVar92._8_4_ * auVar93._8_4_;
              auVar64._12_4_ = auVar92._12_4_ * auVar93._12_4_;
              auVar64._16_4_ = auVar92._16_4_ * auVar93._16_4_;
              auVar64._20_4_ = auVar92._20_4_ * auVar93._20_4_;
              auVar64._24_4_ = auVar92._24_4_ * auVar93._24_4_;
              auVar64._28_4_ = auVar92._28_4_;
              auVar84 = vfmsub231ps_fma(auVar64,auVar103,auVar96);
              auVar65._4_4_ = auVar95._4_4_ * auVar103._4_4_;
              auVar65._0_4_ = auVar95._0_4_ * auVar103._0_4_;
              auVar65._8_4_ = auVar95._8_4_ * auVar103._8_4_;
              auVar65._12_4_ = auVar95._12_4_ * auVar103._12_4_;
              auVar65._16_4_ = auVar95._16_4_ * auVar103._16_4_;
              auVar65._20_4_ = auVar95._20_4_ * auVar103._20_4_;
              auVar65._24_4_ = auVar95._24_4_ * auVar103._24_4_;
              auVar65._28_4_ = auVar95._28_4_;
              auVar7 = vfmsub231ps_fma(auVar65,auVar93,auVar91);
              auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar7));
              auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar6),auVar89);
              auVar91 = vrcp14ps_avx512vl(auVar94);
              auVar93 = auVar198._0_32_;
              auVar92 = vfnmadd213ps_avx512vl(auVar91,auVar94,auVar93);
              auVar82 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
              auVar66._4_4_ = auVar7._4_4_ * auVar120._4_4_;
              auVar66._0_4_ = auVar7._0_4_ * auVar120._0_4_;
              auVar66._8_4_ = auVar7._8_4_ * auVar120._8_4_;
              auVar66._12_4_ = auVar7._12_4_ * auVar120._12_4_;
              auVar66._16_4_ = fVar152 * 0.0;
              auVar66._20_4_ = fVar134 * 0.0;
              auVar66._24_4_ = fVar135 * 0.0;
              auVar66._28_4_ = iVar1;
              auVar84 = vfmadd231ps_fma(auVar66,auVar98,ZEXT1632(auVar84));
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar102,ZEXT1632(auVar6));
              fVar152 = auVar82._0_4_;
              fVar134 = auVar82._4_4_;
              fVar135 = auVar82._8_4_;
              fVar142 = auVar82._12_4_;
              local_3a0 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar142,
                                             CONCAT48(auVar84._8_4_ * fVar135,
                                                      CONCAT44(auVar84._4_4_ * fVar134,
                                                               auVar84._0_4_ * fVar152))));
              uVar143 = vcmpps_avx512vl(local_3a0,auVar184,2);
              auVar68._4_4_ = uStack_47c;
              auVar68._0_4_ = local_480;
              auVar68._8_4_ = uStack_478;
              auVar68._12_4_ = uStack_474;
              auVar68._16_4_ = uStack_470;
              auVar68._20_4_ = uStack_46c;
              auVar68._24_4_ = uStack_468;
              auVar68._28_4_ = uStack_464;
              uVar26 = vcmpps_avx512vl(local_3a0,auVar68,0xd);
              bVar79 = (byte)uVar143 & (byte)uVar26 & bVar79;
              if (bVar79 != 0) {
                uVar143 = vcmpps_avx512vl(auVar94,auVar89,4);
                bVar79 = bVar79 & (byte)uVar143;
                auVar191 = ZEXT3264(local_6c0);
                if (bVar79 != 0) {
                  fVar168 = auVar97._0_4_ * fVar152;
                  fVar170 = auVar97._4_4_ * fVar134;
                  auVar67._4_4_ = fVar170;
                  auVar67._0_4_ = fVar168;
                  fVar80 = auVar97._8_4_ * fVar135;
                  auVar67._8_4_ = fVar80;
                  fVar81 = auVar97._12_4_ * fVar142;
                  auVar67._12_4_ = fVar81;
                  fVar126 = auVar97._16_4_ * 0.0;
                  auVar67._16_4_ = fVar126;
                  fVar151 = auVar97._20_4_ * 0.0;
                  auVar67._20_4_ = fVar151;
                  fVar127 = auVar97._24_4_ * 0.0;
                  auVar67._24_4_ = fVar127;
                  auVar67._28_4_ = auVar94._28_4_;
                  auVar91 = vsubps_avx512vl(auVar93,auVar67);
                  local_3e0._0_4_ =
                       (float)((uint)(bVar70 & 1) * (int)fVar168 |
                              (uint)!(bool)(bVar70 & 1) * auVar91._0_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
                  local_3e0._4_4_ =
                       (float)((uint)bVar18 * (int)fVar170 | (uint)!bVar18 * auVar91._4_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
                  local_3e0._8_4_ =
                       (float)((uint)bVar18 * (int)fVar80 | (uint)!bVar18 * auVar91._8_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
                  local_3e0._12_4_ =
                       (float)((uint)bVar18 * (int)fVar81 | (uint)!bVar18 * auVar91._12_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
                  local_3e0._16_4_ =
                       (float)((uint)bVar18 * (int)fVar126 | (uint)!bVar18 * auVar91._16_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
                  local_3e0._20_4_ =
                       (float)((uint)bVar18 * (int)fVar151 | (uint)!bVar18 * auVar91._20_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
                  local_3e0._24_4_ =
                       (float)((uint)bVar18 * (int)fVar127 | (uint)!bVar18 * auVar91._24_4_);
                  bVar18 = SUB81(uVar71 >> 7,0);
                  local_3e0._28_4_ =
                       (float)((uint)bVar18 * auVar94._28_4_ | (uint)!bVar18 * auVar91._28_4_);
                  auVar94 = vsubps_avx(ZEXT1632(auVar83),auVar99);
                  auVar82 = vfmadd213ps_fma(auVar94,local_3e0,auVar99);
                  uVar136 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar31._4_4_ = uVar136;
                  auVar31._0_4_ = uVar136;
                  auVar31._8_4_ = uVar136;
                  auVar31._12_4_ = uVar136;
                  auVar31._16_4_ = uVar136;
                  auVar31._20_4_ = uVar136;
                  auVar31._24_4_ = uVar136;
                  auVar31._28_4_ = uVar136;
                  auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                               CONCAT48(auVar82._8_4_ +
                                                                        auVar82._8_4_,
                                                                        CONCAT44(auVar82._4_4_ +
                                                                                 auVar82._4_4_,
                                                                                 auVar82._0_4_ +
                                                                                 auVar82._0_4_)))),
                                            auVar31);
                  uVar143 = vcmpps_avx512vl(local_3a0,auVar94,6);
                  if (((byte)uVar143 & bVar79) != 0) {
                    auVar146._0_4_ = auVar90._0_4_ * fVar152;
                    auVar146._4_4_ = auVar90._4_4_ * fVar134;
                    auVar146._8_4_ = auVar90._8_4_ * fVar135;
                    auVar146._12_4_ = auVar90._12_4_ * fVar142;
                    auVar146._16_4_ = auVar90._16_4_ * 0.0;
                    auVar146._20_4_ = auVar90._20_4_ * 0.0;
                    auVar146._24_4_ = auVar90._24_4_ * 0.0;
                    auVar146._28_4_ = 0;
                    auVar94 = vsubps_avx512vl(auVar93,auVar146);
                    auVar125._0_4_ =
                         (uint)(bVar70 & 1) * (int)auVar146._0_4_ |
                         (uint)!(bool)(bVar70 & 1) * auVar94._0_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
                    auVar125._4_4_ =
                         (uint)bVar18 * (int)auVar146._4_4_ | (uint)!bVar18 * auVar94._4_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
                    auVar125._8_4_ =
                         (uint)bVar18 * (int)auVar146._8_4_ | (uint)!bVar18 * auVar94._8_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar18 * (int)auVar146._12_4_ | (uint)!bVar18 * auVar94._12_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
                    auVar125._16_4_ =
                         (uint)bVar18 * (int)auVar146._16_4_ | (uint)!bVar18 * auVar94._16_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
                    auVar125._20_4_ =
                         (uint)bVar18 * (int)auVar146._20_4_ | (uint)!bVar18 * auVar94._20_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
                    auVar125._24_4_ =
                         (uint)bVar18 * (int)auVar146._24_4_ | (uint)!bVar18 * auVar94._24_4_;
                    auVar125._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar94._28_4_;
                    auVar32._8_4_ = 0x40000000;
                    auVar32._0_8_ = 0x4000000040000000;
                    auVar32._12_4_ = 0x40000000;
                    auVar32._16_4_ = 0x40000000;
                    auVar32._20_4_ = 0x40000000;
                    auVar32._24_4_ = 0x40000000;
                    auVar32._28_4_ = 0x40000000;
                    local_3c0 = vfmsub132ps_avx512vl(auVar125,auVar93,auVar32);
                    local_380 = (undefined4)lVar78;
                    local_370 = local_670._0_8_;
                    uStack_368 = local_670._8_8_;
                    local_360 = local_680._0_8_;
                    uStack_358 = local_680._8_8_;
                    local_350 = local_690._0_8_;
                    uStack_348 = local_690._8_8_;
                    pGVar15 = (context->scene->geometries).items[uVar13].ptr;
                    if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar70 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar70 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar82 = vcvtsi2ss_avx512f(auVar101._0_16_,local_380);
                      fVar152 = auVar82._0_4_;
                      local_320[0] = (fVar152 + local_3e0._0_4_ + 0.0) * (float)local_4a0;
                      local_320[1] = (fVar152 + local_3e0._4_4_ + 1.0) * local_4a0._4_4_;
                      local_320[2] = (fVar152 + local_3e0._8_4_ + 2.0) * fStack_498;
                      local_320[3] = (fVar152 + local_3e0._12_4_ + 3.0) * fStack_494;
                      fStack_310 = (fVar152 + local_3e0._16_4_ + 4.0) * fStack_490;
                      fStack_30c = (fVar152 + local_3e0._20_4_ + 5.0) * fStack_48c;
                      fStack_308 = (fVar152 + local_3e0._24_4_ + 6.0) * fStack_488;
                      fStack_304 = fVar152 + local_3e0._28_4_ + 7.0;
                      local_300 = local_3c0;
                      local_2e0 = local_3a0;
                      lVar72 = 0;
                      uVar76 = (ulong)((byte)uVar143 & bVar79);
                      for (uVar71 = uVar76; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        lVar72 = lVar72 + 1;
                      }
                      local_520._0_4_ = (int)uVar75;
                      local_2c0 = auVar184;
                      local_37c = iVar14;
                      do {
                        auVar84 = auVar196._0_16_;
                        local_220 = local_320[lVar72];
                        local_420._0_8_ = lVar72;
                        local_200 = *(undefined4 *)(local_300 + lVar72 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + lVar72 * 4);
                        local_6f0.context = context->user;
                        fVar134 = 1.0 - local_220;
                        fVar152 = fVar134 * fVar134 * -3.0;
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134)),
                                                  ZEXT416((uint)(local_220 * fVar134)),
                                                  ZEXT416(0xc0000000));
                        auVar83 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar134)),
                                                  ZEXT416((uint)(local_220 * local_220)),
                                                  ZEXT416(0x40000000));
                        fVar134 = auVar82._0_4_ * 3.0;
                        fVar135 = auVar83._0_4_ * 3.0;
                        fVar142 = local_220 * local_220 * 3.0;
                        auVar164._0_4_ = fVar142 * (float)local_4d0._0_4_;
                        auVar164._4_4_ = fVar142 * (float)local_4d0._4_4_;
                        auVar164._8_4_ = fVar142 * fStack_4c8;
                        auVar164._12_4_ = fVar142 * fStack_4c4;
                        auVar139._4_4_ = fVar135;
                        auVar139._0_4_ = fVar135;
                        auVar139._8_4_ = fVar135;
                        auVar139._12_4_ = fVar135;
                        auVar82 = vfmadd132ps_fma(auVar139,auVar164,local_690);
                        auVar154._4_4_ = fVar134;
                        auVar154._0_4_ = fVar134;
                        auVar154._8_4_ = fVar134;
                        auVar154._12_4_ = fVar134;
                        auVar82 = vfmadd132ps_fma(auVar154,auVar82,local_680);
                        auVar140._4_4_ = fVar152;
                        auVar140._0_4_ = fVar152;
                        auVar140._8_4_ = fVar152;
                        auVar140._12_4_ = fVar152;
                        auVar82 = vfmadd132ps_fma(auVar140,auVar82,local_670);
                        local_280 = auVar82._0_4_;
                        auVar162._8_4_ = 1;
                        auVar162._0_8_ = 0x100000001;
                        auVar162._12_4_ = 1;
                        auVar162._16_4_ = 1;
                        auVar162._20_4_ = 1;
                        auVar162._24_4_ = 1;
                        auVar162._28_4_ = 1;
                        local_260 = vpermps_avx2(auVar162,ZEXT1632(auVar82));
                        auVar167._8_4_ = 2;
                        auVar167._0_8_ = 0x200000002;
                        auVar167._12_4_ = 2;
                        auVar167._16_4_ = 2;
                        auVar167._20_4_ = 2;
                        auVar167._24_4_ = 2;
                        auVar167._28_4_ = 2;
                        local_240 = vpermps_avx2(auVar167,ZEXT1632(auVar82));
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        fStack_21c = local_220;
                        fStack_218 = local_220;
                        fStack_214 = local_220;
                        fStack_210 = local_220;
                        fStack_20c = local_220;
                        fStack_208 = local_220;
                        fStack_204 = local_220;
                        uStack_1fc = local_200;
                        uStack_1f8 = local_200;
                        uStack_1f4 = local_200;
                        uStack_1f0 = local_200;
                        uStack_1ec = local_200;
                        uStack_1e8 = local_200;
                        uStack_1e4 = local_200;
                        local_1e0 = local_440._0_8_;
                        uStack_1d8 = local_440._8_8_;
                        uStack_1d0 = local_440._16_8_;
                        uStack_1c8 = local_440._24_8_;
                        local_1c0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_1a0 = (local_6f0.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_6f0.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_600 = local_2a0;
                        local_6f0.valid = (int *)local_600;
                        local_6f0.geometryUserPtr = pGVar15->userPtr;
                        local_6f0.hit = (RTCHitN *)&local_280;
                        local_6f0.N = 8;
                        local_4c0._0_8_ = uVar76;
                        local_6f0.ray = (RTCRayN *)ray;
                        if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar15->occlusionFilterN)(&local_6f0);
                          auVar185 = ZEXT3264(local_2c0);
                          uVar75 = (ulong)(uint)local_520._0_4_;
                          auVar191 = ZEXT3264(local_6c0);
                          auVar192 = ZEXT3264(local_580);
                          auVar195 = ZEXT3264(local_560);
                          auVar194 = ZEXT3264(local_500);
                          auVar193 = ZEXT3264(local_540);
                          auVar82 = vxorps_avx512vl(auVar84,auVar84);
                          auVar196 = ZEXT1664(auVar82);
                          uVar76 = local_4c0._0_8_;
                        }
                        auVar82 = auVar196._0_16_;
                        if (local_600 == (undefined1  [32])0x0) {
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar94);
                          auVar197 = ZEXT3264(local_660);
                          auVar200 = ZEXT3264(local_620);
                          auVar199 = ZEXT3264(local_640);
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var17)(&local_6f0);
                            auVar185 = ZEXT3264(local_2c0);
                            uVar75 = (ulong)(uint)local_520._0_4_;
                            auVar191 = ZEXT3264(local_6c0);
                            auVar192 = ZEXT3264(local_580);
                            auVar195 = ZEXT3264(local_560);
                            auVar194 = ZEXT3264(local_500);
                            auVar193 = ZEXT3264(local_540);
                            auVar82 = vxorps_avx512vl(auVar82,auVar82);
                            auVar196 = ZEXT1664(auVar82);
                            uVar76 = local_4c0._0_8_;
                          }
                          uVar71 = vptestmd_avx512vl(local_600,local_600);
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar18 = (bool)((byte)uVar71 & 1);
                          bVar19 = (bool)((byte)(uVar71 >> 1) & 1);
                          bVar20 = (bool)((byte)(uVar71 >> 2) & 1);
                          bVar21 = (bool)((byte)(uVar71 >> 3) & 1);
                          bVar22 = (bool)((byte)(uVar71 >> 4) & 1);
                          bVar23 = (bool)((byte)(uVar71 >> 5) & 1);
                          bVar24 = (bool)((byte)(uVar71 >> 6) & 1);
                          bVar25 = SUB81(uVar71 >> 7,0);
                          *(uint *)(local_6f0.ray + 0x100) =
                               (uint)bVar18 * auVar94._0_4_ |
                               (uint)!bVar18 * *(int *)(local_6f0.ray + 0x100);
                          *(uint *)(local_6f0.ray + 0x104) =
                               (uint)bVar19 * auVar94._4_4_ |
                               (uint)!bVar19 * *(int *)(local_6f0.ray + 0x104);
                          *(uint *)(local_6f0.ray + 0x108) =
                               (uint)bVar20 * auVar94._8_4_ |
                               (uint)!bVar20 * *(int *)(local_6f0.ray + 0x108);
                          *(uint *)(local_6f0.ray + 0x10c) =
                               (uint)bVar21 * auVar94._12_4_ |
                               (uint)!bVar21 * *(int *)(local_6f0.ray + 0x10c);
                          *(uint *)(local_6f0.ray + 0x110) =
                               (uint)bVar22 * auVar94._16_4_ |
                               (uint)!bVar22 * *(int *)(local_6f0.ray + 0x110);
                          *(uint *)(local_6f0.ray + 0x114) =
                               (uint)bVar23 * auVar94._20_4_ |
                               (uint)!bVar23 * *(int *)(local_6f0.ray + 0x114);
                          *(uint *)(local_6f0.ray + 0x118) =
                               (uint)bVar24 * auVar94._24_4_ |
                               (uint)!bVar24 * *(int *)(local_6f0.ray + 0x118);
                          *(uint *)(local_6f0.ray + 0x11c) =
                               (uint)bVar25 * auVar94._28_4_ |
                               (uint)!bVar25 * *(int *)(local_6f0.ray + 0x11c);
                          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar94);
                          auVar197 = ZEXT3264(local_660);
                          auVar200 = ZEXT3264(local_620);
                          auVar199 = ZEXT3264(local_640);
                          if (local_600 != (undefined1  [32])0x0) {
                            bVar70 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar185._0_4_;
                        bVar70 = 0;
                        lVar72 = 0;
                        uVar76 = uVar76 ^ 1L << (local_420._0_8_ & 0x3f);
                        for (uVar71 = uVar76; (uVar71 & 1) == 0;
                            uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                          lVar72 = lVar72 + 1;
                        }
                      } while (uVar76 != 0);
                    }
                    uVar75 = CONCAT71((int7)(uVar75 >> 8),(byte)uVar75 | bVar70);
                  }
                }
                goto LAB_01ddc227;
              }
            }
            auVar191 = ZEXT3264(local_6c0);
          }
LAB_01ddc227:
          lVar78 = lVar78 + 8;
        } while ((int)lVar78 < iVar14);
      }
      bVar79 = (byte)uVar75;
      if ((uVar75 & 1) != 0) break;
      uVar136 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar30._4_4_ = uVar136;
      auVar30._0_4_ = uVar136;
      auVar30._8_4_ = uVar136;
      auVar30._12_4_ = uVar136;
      auVar30._16_4_ = uVar136;
      auVar30._20_4_ = uVar136;
      auVar30._24_4_ = uVar136;
      auVar30._28_4_ = uVar136;
      uVar143 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar77 = (uint)uVar73 & (uint)uVar73 + 0xff & (uint)uVar143;
      uVar73 = (ulong)uVar77;
    } while (uVar77 != 0);
  }
  return (bool)(bVar79 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }